

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unixmake2.cpp
# Opt level: O2

void __thiscall UnixMakefileGenerator::init2(UnixMakefileGenerator *this)

{
  QMakeProject **ppQVar1;
  char16_t **ppcVar2;
  long lVar3;
  char (*pacVar4) [4];
  Data *pDVar5;
  char16_t *pcVar6;
  bool bVar7;
  char cVar8;
  QList<ProString> *pQVar9;
  QArrayDataPointer<ProString> *pQVar10;
  iterator iVar11;
  ProStringList *pPVar12;
  QList<ProString> *pQVar13;
  ProString *pPVar14;
  QLatin1String *pQVar15;
  QString *str;
  pointer this_00;
  QArrayDataPointer<ProString> *pQVar16;
  qsizetype qVar17;
  QMakeProject *pQVar18;
  char *pcVar19;
  QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>
  *this_01;
  QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>
  *pQVar20;
  long in_FS_OFFSET;
  QList<ProString> *local_840;
  ProKey local_828;
  ProString local_7f8;
  ProKey local_7c8;
  ProString local_798;
  QStringBuilder<const_char_(&)[4],_ProString> local_768;
  QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]> local_730;
  QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>
  local_6f0;
  QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>
  local_680;
  ProString bundle_loc_1;
  ProString soname;
  QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>
  local_4a8;
  ProString bundle_loc;
  ProString MD_flag;
  ProKey local_1b8;
  ProString local_188;
  ProKey local_158;
  ProString local_128;
  ProString local_f8;
  ProString local_c8;
  ProString local_98;
  ProString local_68;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  ppQVar1 = &(this->super_MakefileGenerator).project;
  pQVar18 = (this->super_MakefileGenerator).project;
  ProKey::ProKey((ProKey *)&MD_flag,"QMAKE_FRAMEWORK_VERSION");
  bVar7 = QMakeProject::isEmpty(pQVar18,(ProKey *)&MD_flag);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&MD_flag);
  if (bVar7) {
    pQVar18 = *ppQVar1;
    ProKey::ProKey((ProKey *)&MD_flag,"QMAKE_FRAMEWORK_VERSION");
    pQVar9 = &QMakeEvaluator::valuesRef(&pQVar18->super_QMakeEvaluator,(ProKey *)&MD_flag)->
              super_QList<ProString>;
    pQVar18 = *ppQVar1;
    ProKey::ProKey((ProKey *)&local_4a8,"VER_MAJ");
    QMakeEvaluator::first(&bundle_loc,&pQVar18->super_QMakeEvaluator,(ProKey *)&local_4a8);
    QList<ProString>::emplaceBack<ProString>(pQVar9,&bundle_loc);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&bundle_loc);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_4a8);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&MD_flag);
  }
  pQVar18 = *ppQVar1;
  ProKey::ProKey((ProKey *)&bundle_loc,"TEMPLATE");
  QMakeEvaluator::first(&MD_flag,&pQVar18->super_QMakeEvaluator,(ProKey *)&bundle_loc);
  bVar7 = ProString::operator==(&MD_flag,"aux");
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&MD_flag);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&bundle_loc);
  if (bVar7) {
    pQVar18 = *ppQVar1;
    ProKey::ProKey((ProKey *)&soname,"QMAKE_PREFIX_STATICLIB");
    QMakeEvaluator::first((ProString *)&local_4a8,&pQVar18->super_QMakeEvaluator,(ProKey *)&soname);
    pQVar18 = *ppQVar1;
    ProKey::ProKey((ProKey *)&local_680,"TARGET");
    QMakeEvaluator::first(&bundle_loc_1,&pQVar18->super_QMakeEvaluator,(ProKey *)&local_680);
    QStringBuilder<ProString,_ProString>::QStringBuilder
              ((QStringBuilder<ProString,_ProString> *)&MD_flag,(ProString *)&local_4a8,
               &bundle_loc_1);
    ProString::ProString<ProString,ProString>
              (&bundle_loc,(QStringBuilder<ProString,_ProString> *)&MD_flag);
    ProStringList::ProStringList((ProStringList *)&local_730,&bundle_loc);
    pQVar18 = *ppQVar1;
    ProKey::ProKey((ProKey *)&local_6f0,"PRL_TARGET");
    pQVar10 = (QArrayDataPointer<ProString> *)
              QMakeEvaluator::valuesRef(&pQVar18->super_QMakeEvaluator,(ProKey *)&local_6f0);
    QArrayDataPointer<ProString>::operator=(pQVar10,(QArrayDataPointer<ProString> *)&local_730);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_6f0);
    QArrayDataPointer<ProString>::~QArrayDataPointer((QArrayDataPointer<ProString> *)&local_730);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&bundle_loc);
    QStringBuilder<ProString,_ProString>::~QStringBuilder
              ((QStringBuilder<ProString,_ProString> *)&MD_flag);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&bundle_loc_1);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_680);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_4a8);
    this_01 = (QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>
               *)&soname;
LAB_00191ade:
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)this_01);
  }
  else {
    pQVar18 = *ppQVar1;
    ProKey::ProKey((ProKey *)&MD_flag,"QMAKE_APP_FLAG");
    pPVar12 = QMakeEvaluator::valuesRef(&pQVar18->super_QMakeEvaluator,(ProKey *)&MD_flag);
    lVar3 = (pPVar12->super_QList<ProString>).d.size;
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&MD_flag);
    pQVar18 = *ppQVar1;
    if (lVar3 == 0) {
      QString::QString(&MD_flag.m_string,"staticlib");
      bVar7 = QMakeProject::isActiveConfig(pQVar18,&MD_flag.m_string,false);
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&MD_flag);
      if (bVar7) {
        pQVar18 = *ppQVar1;
        ProKey::ProKey((ProKey *)&MD_flag,"TARGET");
        pQVar9 = &QMakeEvaluator::valuesRef(&pQVar18->super_QMakeEvaluator,(ProKey *)&MD_flag)->
                  super_QList<ProString>;
        iVar11 = QList<ProString>::begin(pQVar9);
        pQVar18 = *ppQVar1;
        ProKey::ProKey((ProKey *)&local_4a8,"QMAKE_PREFIX_STATICLIB");
        QMakeEvaluator::first(&bundle_loc,&pQVar18->super_QMakeEvaluator,(ProKey *)&local_4a8);
        pPVar14 = ProString::prepend(iVar11.i,&bundle_loc);
        ProStringList::ProStringList((ProStringList *)&bundle_loc_1,pPVar14);
        pQVar18 = *ppQVar1;
        ProKey::ProKey((ProKey *)&soname,"PRL_TARGET");
        pQVar10 = (QArrayDataPointer<ProString> *)
                  QMakeEvaluator::valuesRef(&pQVar18->super_QMakeEvaluator,(ProKey *)&soname);
        QArrayDataPointer<ProString>::operator=
                  (pQVar10,(QArrayDataPointer<ProString> *)&bundle_loc_1);
        QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&soname);
        QArrayDataPointer<ProString>::~QArrayDataPointer
                  ((QArrayDataPointer<ProString> *)&bundle_loc_1);
        QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&bundle_loc);
        QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_4a8);
        QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&MD_flag);
        pQVar18 = *ppQVar1;
        ProKey::ProKey((ProKey *)&local_4a8,"QMAKE_EXTENSION_STATICLIB");
        QMakeEvaluator::first(&bundle_loc,&pQVar18->super_QMakeEvaluator,(ProKey *)&local_4a8);
        MD_flag.m_string.d.d = (Data *)0x2252f2;
        ppcVar2 = &MD_flag.m_string.d.ptr;
        ProString::ProString((ProString *)ppcVar2,&bundle_loc);
        pQVar18 = *ppQVar1;
        ProKey::ProKey((ProKey *)&soname,"TARGET");
        pQVar9 = &QMakeEvaluator::valuesRef(&pQVar18->super_QMakeEvaluator,(ProKey *)&soname)->
                  super_QList<ProString>;
        iVar11 = QList<ProString>::begin(pQVar9);
        ProString::operator+=(iVar11.i,(QStringBuilder<const_char_(&)[2],_ProString> *)&MD_flag);
        QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&soname);
        QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)ppcVar2);
        QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&bundle_loc);
        QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_4a8);
        pQVar18 = *ppQVar1;
        ProKey::ProKey((ProKey *)&MD_flag,"QMAKE_AR_CMD");
        pPVar12 = QMakeEvaluator::valuesRef(&pQVar18->super_QMakeEvaluator,(ProKey *)&MD_flag);
        lVar3 = (pPVar12->super_QList<ProString>).d.size;
        QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&MD_flag);
        if (lVar3 == 0) {
          pQVar18 = *ppQVar1;
          this_01 = (QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>
                     *)&MD_flag;
          ProKey::ProKey((ProKey *)this_01,"QMAKE_AR_CMD");
          pQVar9 = &QMakeEvaluator::valuesRef(&pQVar18->super_QMakeEvaluator,(ProKey *)this_01)->
                    super_QList<ProString>;
          ProString::ProString(&bundle_loc,"$(AR) $(DESTDIR)$(TARGET) $(OBJECTS)");
          QList<ProString>::emplaceBack<ProString>(pQVar9,&bundle_loc);
          QArrayDataPointer<char16_t>::~QArrayDataPointer
                    ((QArrayDataPointer<char16_t> *)&bundle_loc);
          goto LAB_00191ade;
        }
      }
      else {
        pQVar18 = *ppQVar1;
        ProKey::ProKey((ProKey *)&bundle_loc_1,"TARGETA");
        pQVar9 = &QMakeEvaluator::valuesRef(&pQVar18->super_QMakeEvaluator,(ProKey *)&bundle_loc_1)
                  ->super_QList<ProString>;
        pQVar18 = *ppQVar1;
        ProKey::ProKey((ProKey *)&local_730,"DESTDIR");
        QMakeEvaluator::first
                  ((ProString *)&local_6f0,&pQVar18->super_QMakeEvaluator,(ProKey *)&local_730);
        pQVar18 = *ppQVar1;
        ProKey::ProKey((ProKey *)&local_68,"QMAKE_PREFIX_STATICLIB");
        QMakeEvaluator::first
                  ((ProString *)&local_768,&pQVar18->super_QMakeEvaluator,(ProKey *)&local_68);
        QStringBuilder<ProString,_ProString>::QStringBuilder
                  ((QStringBuilder<ProString,_ProString> *)&soname,(ProString *)&local_6f0,
                   (ProString *)&local_768);
        pQVar18 = *ppQVar1;
        ProKey::ProKey((ProKey *)&local_c8,"TARGET");
        QMakeEvaluator::first(&local_98,&pQVar18->super_QMakeEvaluator,(ProKey *)&local_c8);
        QStringBuilder<QStringBuilder<ProString,_ProString>,_ProString>::QStringBuilder
                  ((QStringBuilder<QStringBuilder<ProString,_ProString>,_ProString> *)&local_4a8,
                   (QStringBuilder<ProString,_ProString> *)&soname,&local_98);
        QStringBuilder<QStringBuilder<ProString,_ProString>,_ProString>::QStringBuilder
                  ((QStringBuilder<QStringBuilder<ProString,_ProString>,_ProString> *)&bundle_loc,
                   (QStringBuilder<QStringBuilder<ProString,_ProString>,_ProString> *)&local_4a8);
        pQVar18 = *ppQVar1;
        ProKey::ProKey((ProKey *)&local_128,"QMAKE_EXTENSION_STATICLIB");
        QMakeEvaluator::first(&local_f8,&pQVar18->super_QMakeEvaluator,(ProKey *)&local_128);
        QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<ProString,_ProString>,_ProString>,_const_char_(&)[2]>,_ProString>
        ::QStringBuilder((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<ProString,_ProString>,_ProString>,_const_char_(&)[2]>,_ProString>
                          *)&MD_flag,
                         (QStringBuilder<QStringBuilder<QStringBuilder<ProString,_ProString>,_ProString>,_const_char_(&)[2]>
                          *)&bundle_loc,&local_f8);
        ProString::
        ProString<QStringBuilder<QStringBuilder<QStringBuilder<ProString,ProString>,ProString>,char_const(&)[2]>,ProString>
                  ((ProString *)&local_680,
                   (QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<ProString,_ProString>,_ProString>,_const_char_(&)[2]>,_ProString>
                    *)&MD_flag);
        QList<ProString>::emplaceBack<ProString>(pQVar9,(ProString *)&local_680);
        QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_680);
        QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<ProString,_ProString>,_ProString>,_const_char_(&)[2]>,_ProString>
        ::~QStringBuilder((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<ProString,_ProString>,_ProString>,_const_char_(&)[2]>,_ProString>
                           *)&MD_flag);
        QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_f8);
        QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_128);
        QStringBuilder<QStringBuilder<ProString,_ProString>,_ProString>::~QStringBuilder
                  ((QStringBuilder<QStringBuilder<ProString,_ProString>,_ProString> *)&bundle_loc);
        QStringBuilder<QStringBuilder<ProString,_ProString>,_ProString>::~QStringBuilder
                  ((QStringBuilder<QStringBuilder<ProString,_ProString>,_ProString> *)&local_4a8);
        QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_98);
        QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_c8);
        QStringBuilder<ProString,_ProString>::~QStringBuilder
                  ((QStringBuilder<ProString,_ProString> *)&soname);
        QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_768);
        QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_68);
        QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_6f0);
        QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_730);
        QArrayDataPointer<char16_t>::~QArrayDataPointer
                  ((QArrayDataPointer<char16_t> *)&bundle_loc_1);
        pQVar18 = *ppQVar1;
        ProKey::ProKey((ProKey *)&MD_flag,"QMAKE_AR_CMD");
        pQVar9 = &QMakeEvaluator::valuesRef(&pQVar18->super_QMakeEvaluator,(ProKey *)&MD_flag)->
                  super_QList<ProString>;
        QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&MD_flag);
        if ((pQVar9->d).size == 0) {
          pPVar14 = &MD_flag;
          ProString::ProString(pPVar14,"$(AR) $(TARGETA) $(OBJECTS)");
          QList<ProString>::emplaceBack<ProString>(pQVar9,pPVar14);
        }
        else {
          pPVar14 = &bundle_loc;
          ProString::toQString(&pPVar14->m_string,(pQVar9->d).ptr);
          pQVar15 = (QLatin1String *)QtPrivate::lengthHelperPointer<char>("(TARGET)");
          QtPrivate::lengthHelperPointer<char>("(TARGETA)");
          str = (QString *)QString::replace((QLatin1String *)pPVar14,pQVar15,0x21ce7f);
          ProString::ProString(&MD_flag,str);
          this_00 = QList<ProString>::data(pQVar9);
          ProString::operator=(this_00,&MD_flag);
          QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&MD_flag);
        }
        QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)pPVar14);
        pQVar18 = *ppQVar1;
        ProKey::ProKey((ProKey *)&MD_flag,"QMAKE_BUNDLE");
        bVar7 = QMakeProject::isEmpty(pQVar18,(ProKey *)&MD_flag);
        QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&MD_flag);
        pQVar18 = *ppQVar1;
        if (bVar7) {
          QString::QString(&MD_flag.m_string,"plugin");
          bVar7 = QMakeProject::isActiveConfig(pQVar18,&MD_flag.m_string,false);
          QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&MD_flag);
          if (bVar7) {
            local_128.m_string.d.d = (Data *)0x0;
            local_128.m_string.d.ptr = (char16_t *)0x0;
            local_128.m_string.d.size = 0;
            pQVar18 = *ppQVar1;
            QString::QString(&MD_flag.m_string,"no_plugin_name_prefix");
            bVar7 = QMakeProject::isActiveConfig(pQVar18,&MD_flag.m_string,false);
            QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&MD_flag)
            ;
            if (!bVar7) {
              QString::operator=(&local_128.m_string,"lib");
            }
            pQVar18 = *ppQVar1;
            ProKey::ProKey((ProKey *)&bundle_loc,"PRL_TARGET");
            pQVar9 = &QMakeEvaluator::valuesRef
                                (&pQVar18->super_QMakeEvaluator,(ProKey *)&bundle_loc)->
                      super_QList<ProString>;
            pQVar18 = *ppQVar1;
            ProKey::ProKey((ProKey *)&bundle_loc_1,"TARGET");
            QMakeEvaluator::first(&soname,&pQVar18->super_QMakeEvaluator,(ProKey *)&bundle_loc_1);
            ppcVar2 = &MD_flag.m_string.d.ptr;
            MD_flag.m_string.d.d = (Data *)&local_128;
            ProString::ProString((ProString *)ppcVar2,&soname);
            ProString::ProString<QString&,ProString>
                      ((ProString *)&local_4a8,(QStringBuilder<QString_&,_ProString> *)&MD_flag);
            QList<ProString>::emplaceFront<ProString>(pQVar9,(ProString *)&local_4a8);
            QArrayDataPointer<char16_t>::~QArrayDataPointer
                      ((QArrayDataPointer<char16_t> *)&local_4a8);
            QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)ppcVar2);
            QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&soname);
            QArrayDataPointer<char16_t>::~QArrayDataPointer
                      ((QArrayDataPointer<char16_t> *)&bundle_loc_1);
            QArrayDataPointer<char16_t>::~QArrayDataPointer
                      ((QArrayDataPointer<char16_t> *)&bundle_loc);
            pQVar18 = *ppQVar1;
            ProKey::ProKey((ProKey *)&soname,"TARGET_x.y.z");
            pQVar9 = &QMakeEvaluator::valuesRef(&pQVar18->super_QMakeEvaluator,(ProKey *)&soname)->
                      super_QList<ProString>;
            pQVar18 = *ppQVar1;
            ProKey::ProKey((ProKey *)&local_6f0,"TARGET");
            QMakeEvaluator::first
                      ((ProString *)&local_680,&pQVar18->super_QMakeEvaluator,(ProKey *)&local_6f0);
            local_4a8.a.a.a.a.a.a.a = (char (*) [4])&local_128;
            ProString::ProString
                      ((ProString *)((long)&local_4a8.a.a.a.a.a + 8),(ProString *)&local_680);
            QStringBuilder<QString_&,_ProString>::QStringBuilder
                      ((QStringBuilder<QString_&,_ProString> *)&bundle_loc,
                       (QStringBuilder<QString_&,_ProString> *)&local_4a8);
            pQVar18 = *ppQVar1;
            ProKey::ProKey((ProKey *)&local_768,"QMAKE_EXTENSION_PLUGIN");
            QMakeEvaluator::first
                      ((ProString *)&local_730,&pQVar18->super_QMakeEvaluator,(ProKey *)&local_768);
            QStringBuilder<QStringBuilder<QStringBuilder<QString_&,_ProString>,_const_char_(&)[2]>,_ProString>
            ::QStringBuilder((QStringBuilder<QStringBuilder<QStringBuilder<QString_&,_ProString>,_const_char_(&)[2]>,_ProString>
                              *)&MD_flag,
                             (QStringBuilder<QStringBuilder<QString_&,_ProString>,_const_char_(&)[2]>
                              *)&bundle_loc,(ProString *)&local_730);
            ProString::
            ProString<QStringBuilder<QStringBuilder<QString&,ProString>,char_const(&)[2]>,ProString>
                      (&bundle_loc_1,
                       (QStringBuilder<QStringBuilder<QStringBuilder<QString_&,_ProString>,_const_char_(&)[2]>,_ProString>
                        *)&MD_flag);
            QList<ProString>::emplaceBack<ProString>(pQVar9,&bundle_loc_1);
            QArrayDataPointer<char16_t>::~QArrayDataPointer
                      ((QArrayDataPointer<char16_t> *)&bundle_loc_1);
            QStringBuilder<QStringBuilder<QStringBuilder<QString_&,_ProString>,_const_char_(&)[2]>,_ProString>
            ::~QStringBuilder((QStringBuilder<QStringBuilder<QStringBuilder<QString_&,_ProString>,_const_char_(&)[2]>,_ProString>
                               *)&MD_flag);
            QArrayDataPointer<char16_t>::~QArrayDataPointer
                      ((QArrayDataPointer<char16_t> *)&local_730);
            QArrayDataPointer<char16_t>::~QArrayDataPointer
                      ((QArrayDataPointer<char16_t> *)&local_768);
            QArrayDataPointer<char16_t>::~QArrayDataPointer
                      ((QArrayDataPointer<char16_t> *)&bundle_loc.m_string.d.ptr);
            QArrayDataPointer<char16_t>::~QArrayDataPointer
                      ((QArrayDataPointer<char16_t> *)((long)&local_4a8.a.a.a.a.a + 8));
            QArrayDataPointer<char16_t>::~QArrayDataPointer
                      ((QArrayDataPointer<char16_t> *)&local_680);
            QArrayDataPointer<char16_t>::~QArrayDataPointer
                      ((QArrayDataPointer<char16_t> *)&local_6f0);
            QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&soname);
            pQVar18 = *ppQVar1;
            QString::QString(&MD_flag.m_string,"lib_version_first");
            bVar7 = QMakeProject::isActiveConfig(pQVar18,&MD_flag.m_string,false);
            QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&MD_flag)
            ;
            pQVar18 = *ppQVar1;
            if (bVar7) {
              ProKey::ProKey((ProKey *)&local_680,"TARGET_x");
              local_840 = &QMakeEvaluator::valuesRef
                                     (&pQVar18->super_QMakeEvaluator,(ProKey *)&local_680)->
                           super_QList<ProString>;
              pQVar18 = *ppQVar1;
              ProKey::ProKey((ProKey *)&local_768,"TARGET");
              QMakeEvaluator::first
                        ((ProString *)&local_730,&pQVar18->super_QMakeEvaluator,(ProKey *)&local_768
                        );
              bundle_loc_1.m_string.d.d = (Data *)&local_128;
              ProString::ProString
                        ((ProString *)&bundle_loc_1.m_string.d.ptr,(ProString *)&local_730);
              QStringBuilder<QString_&,_ProString>::QStringBuilder
                        ((QStringBuilder<QString_&,_ProString> *)&soname,
                         (QStringBuilder<QString_&,_ProString> *)&bundle_loc_1);
              pQVar18 = *ppQVar1;
              ProKey::ProKey((ProKey *)&local_98,"VER_MAJ");
              QMakeEvaluator::first(&local_68,&pQVar18->super_QMakeEvaluator,(ProKey *)&local_98);
              QStringBuilder<QStringBuilder<QStringBuilder<QString_&,_ProString>,_const_char_(&)[2]>,_ProString>
              ::QStringBuilder((QStringBuilder<QStringBuilder<QStringBuilder<QString_&,_ProString>,_const_char_(&)[2]>,_ProString>
                                *)&local_4a8,
                               (QStringBuilder<QStringBuilder<QString_&,_ProString>,_const_char_(&)[2]>
                                *)&soname,&local_68);
              QStringBuilder<QStringBuilder<QStringBuilder<QString_&,_ProString>,_const_char_(&)[2]>,_ProString>
              ::QStringBuilder((QStringBuilder<QStringBuilder<QStringBuilder<QString_&,_ProString>,_const_char_(&)[2]>,_ProString>
                                *)&bundle_loc,
                               (QStringBuilder<QStringBuilder<QStringBuilder<QString_&,_ProString>,_const_char_(&)[2]>,_ProString>
                                *)&local_4a8);
              pQVar18 = *ppQVar1;
              pcVar19 = "QMAKE_EXTENSION_PLUGIN";
            }
            else {
              ProKey::ProKey((ProKey *)&local_680,"TARGET_x");
              local_840 = &QMakeEvaluator::valuesRef
                                     (&pQVar18->super_QMakeEvaluator,(ProKey *)&local_680)->
                           super_QList<ProString>;
              pQVar18 = *ppQVar1;
              ProKey::ProKey((ProKey *)&local_768,"TARGET");
              QMakeEvaluator::first
                        ((ProString *)&local_730,&pQVar18->super_QMakeEvaluator,(ProKey *)&local_768
                        );
              bundle_loc_1.m_string.d.d = (Data *)&local_128;
              ProString::ProString
                        ((ProString *)&bundle_loc_1.m_string.d.ptr,(ProString *)&local_730);
              QStringBuilder<QString_&,_ProString>::QStringBuilder
                        ((QStringBuilder<QString_&,_ProString> *)&soname,
                         (QStringBuilder<QString_&,_ProString> *)&bundle_loc_1);
              pQVar18 = *ppQVar1;
              ProKey::ProKey((ProKey *)&local_98,"QMAKE_EXTENSION_PLUGIN");
              QMakeEvaluator::first(&local_68,&pQVar18->super_QMakeEvaluator,(ProKey *)&local_98);
              QStringBuilder<QStringBuilder<QStringBuilder<QString_&,_ProString>,_const_char_(&)[2]>,_ProString>
              ::QStringBuilder((QStringBuilder<QStringBuilder<QStringBuilder<QString_&,_ProString>,_const_char_(&)[2]>,_ProString>
                                *)&local_4a8,
                               (QStringBuilder<QStringBuilder<QString_&,_ProString>,_const_char_(&)[2]>
                                *)&soname,&local_68);
              QStringBuilder<QStringBuilder<QStringBuilder<QString_&,_ProString>,_const_char_(&)[2]>,_ProString>
              ::QStringBuilder((QStringBuilder<QStringBuilder<QStringBuilder<QString_&,_ProString>,_const_char_(&)[2]>,_ProString>
                                *)&bundle_loc,
                               (QStringBuilder<QStringBuilder<QStringBuilder<QString_&,_ProString>,_const_char_(&)[2]>,_ProString>
                                *)&local_4a8);
              pQVar18 = *ppQVar1;
              pcVar19 = "VER_MAJ";
            }
            ProKey::ProKey((ProKey *)&local_f8,pcVar19);
            QMakeEvaluator::first(&local_c8,&pQVar18->super_QMakeEvaluator,(ProKey *)&local_f8);
            QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString_&,_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>
            ::QStringBuilder((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString_&,_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>
                              *)&MD_flag,
                             (QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString_&,_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>
                              *)&bundle_loc,&local_c8);
            ProString::
            ProString<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString&,ProString>,char_const(&)[2]>,ProString>,char_const(&)[2]>,ProString>
                      ((ProString *)&local_6f0,
                       (QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString_&,_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>
                        *)&MD_flag);
            QList<ProString>::emplaceBack<ProString>(local_840,(ProString *)&local_6f0);
            QArrayDataPointer<char16_t>::~QArrayDataPointer
                      ((QArrayDataPointer<char16_t> *)&local_6f0);
            QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString_&,_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>
            ::~QStringBuilder((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString_&,_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>
                               *)&MD_flag);
            QArrayDataPointer<char16_t>::~QArrayDataPointer
                      ((QArrayDataPointer<char16_t> *)&local_c8);
            QArrayDataPointer<char16_t>::~QArrayDataPointer
                      ((QArrayDataPointer<char16_t> *)&local_f8);
            QStringBuilder<QStringBuilder<QStringBuilder<QString_&,_ProString>,_const_char_(&)[2]>,_ProString>
            ::~QStringBuilder((QStringBuilder<QStringBuilder<QStringBuilder<QString_&,_ProString>,_const_char_(&)[2]>,_ProString>
                               *)&bundle_loc);
            QStringBuilder<QStringBuilder<QStringBuilder<QString_&,_ProString>,_const_char_(&)[2]>,_ProString>
            ::~QStringBuilder((QStringBuilder<QStringBuilder<QStringBuilder<QString_&,_ProString>,_const_char_(&)[2]>,_ProString>
                               *)&local_4a8);
            QArrayDataPointer<char16_t>::~QArrayDataPointer
                      ((QArrayDataPointer<char16_t> *)&local_68);
            QArrayDataPointer<char16_t>::~QArrayDataPointer
                      ((QArrayDataPointer<char16_t> *)&local_98);
            QArrayDataPointer<char16_t>::~QArrayDataPointer
                      ((QArrayDataPointer<char16_t> *)&soname.m_string.d.ptr);
            QArrayDataPointer<char16_t>::~QArrayDataPointer
                      ((QArrayDataPointer<char16_t> *)&bundle_loc_1.m_string.d.ptr);
            QArrayDataPointer<char16_t>::~QArrayDataPointer
                      ((QArrayDataPointer<char16_t> *)&local_730);
            QArrayDataPointer<char16_t>::~QArrayDataPointer
                      ((QArrayDataPointer<char16_t> *)&local_768);
            QArrayDataPointer<char16_t>::~QArrayDataPointer
                      ((QArrayDataPointer<char16_t> *)&local_680);
            pQVar18 = *ppQVar1;
            ProKey::ProKey((ProKey *)&MD_flag,"TARGET_x.y.z");
            pQVar10 = (QArrayDataPointer<ProString> *)
                      QMakeEvaluator::valuesRef(&pQVar18->super_QMakeEvaluator,(ProKey *)&MD_flag);
            pQVar18 = *ppQVar1;
            ProKey::ProKey((ProKey *)&bundle_loc,"TARGET");
            pQVar16 = (QArrayDataPointer<ProString> *)
                      QMakeEvaluator::valuesRef
                                (&pQVar18->super_QMakeEvaluator,(ProKey *)&bundle_loc);
            QArrayDataPointer<ProString>::operator=(pQVar16,pQVar10);
            QArrayDataPointer<char16_t>::~QArrayDataPointer
                      ((QArrayDataPointer<char16_t> *)&bundle_loc);
            QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&MD_flag)
            ;
            pPVar14 = &local_128;
          }
          else {
            pQVar18 = *ppQVar1;
            ProKey::ProKey((ProKey *)&MD_flag,"QMAKE_HPUX_SHLIB");
            bVar7 = QMakeProject::isEmpty(pQVar18,(ProKey *)&MD_flag);
            QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&MD_flag)
            ;
            pQVar18 = *ppQVar1;
            if (bVar7) {
              ProKey::ProKey((ProKey *)&MD_flag,"QMAKE_AIX_SHLIB");
              bVar7 = QMakeProject::isEmpty(pQVar18,(ProKey *)&MD_flag);
              QArrayDataPointer<char16_t>::~QArrayDataPointer
                        ((QArrayDataPointer<char16_t> *)&MD_flag);
              pQVar18 = *ppQVar1;
              if (bVar7) {
                ProKey::ProKey((ProKey *)&bundle_loc,"PRL_TARGET");
                pQVar9 = &QMakeEvaluator::valuesRef
                                    (&pQVar18->super_QMakeEvaluator,(ProKey *)&bundle_loc)->
                          super_QList<ProString>;
                pQVar18 = *ppQVar1;
                ProKey::ProKey((ProKey *)&bundle_loc_1,"TARGET");
                QMakeEvaluator::first
                          (&soname,&pQVar18->super_QMakeEvaluator,(ProKey *)&bundle_loc_1);
                ppcVar2 = &MD_flag.m_string.d.ptr;
                MD_flag.m_string.d.d = (Data *)0x222550;
                ProString::ProString((ProString *)ppcVar2,&soname);
                ProString::ProString<char_const(&)[4],ProString>
                          ((ProString *)&local_4a8,
                           (QStringBuilder<const_char_(&)[4],_ProString> *)&MD_flag);
                QList<ProString>::emplaceFront<ProString>(pQVar9,(ProString *)&local_4a8);
                QArrayDataPointer<char16_t>::~QArrayDataPointer
                          ((QArrayDataPointer<char16_t> *)&local_4a8);
                QArrayDataPointer<char16_t>::~QArrayDataPointer
                          ((QArrayDataPointer<char16_t> *)ppcVar2);
                QArrayDataPointer<char16_t>::~QArrayDataPointer
                          ((QArrayDataPointer<char16_t> *)&soname);
                QArrayDataPointer<char16_t>::~QArrayDataPointer
                          ((QArrayDataPointer<char16_t> *)&bundle_loc_1);
                QArrayDataPointer<char16_t>::~QArrayDataPointer
                          ((QArrayDataPointer<char16_t> *)&bundle_loc);
                pQVar18 = *ppQVar1;
                ProKey::ProKey((ProKey *)&soname,"TARGET_");
                pQVar9 = &QMakeEvaluator::valuesRef
                                    (&pQVar18->super_QMakeEvaluator,(ProKey *)&soname)->
                          super_QList<ProString>;
                pQVar18 = *ppQVar1;
                ProKey::ProKey((ProKey *)&local_6f0,"TARGET");
                QMakeEvaluator::first
                          ((ProString *)&local_680,&pQVar18->super_QMakeEvaluator,
                           (ProKey *)&local_6f0);
                local_4a8.a.a.a.a.a.a.a = (char (*) [4])0x222550;
                ProString::ProString
                          ((ProString *)((long)&local_4a8.a.a.a.a.a + 8),(ProString *)&local_680);
                QStringBuilder<const_char_(&)[4],_ProString>::QStringBuilder
                          ((QStringBuilder<const_char_(&)[4],_ProString> *)&bundle_loc,
                           (QStringBuilder<const_char_(&)[4],_ProString> *)&local_4a8);
                pQVar18 = *ppQVar1;
                ProKey::ProKey((ProKey *)&local_768,"QMAKE_EXTENSION_SHLIB");
                QMakeEvaluator::first
                          ((ProString *)&local_730,&pQVar18->super_QMakeEvaluator,
                           (ProKey *)&local_768);
                QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>
                ::QStringBuilder((QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>
                                  *)&MD_flag,
                                 (QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>
                                  *)&bundle_loc,(ProString *)&local_730);
                ProString::
                ProString<QStringBuilder<QStringBuilder<char_const(&)[4],ProString>,char_const(&)[2]>,ProString>
                          (&bundle_loc_1,
                           (QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>
                            *)&MD_flag);
                QList<ProString>::emplaceBack<ProString>(pQVar9,&bundle_loc_1);
                QArrayDataPointer<char16_t>::~QArrayDataPointer
                          ((QArrayDataPointer<char16_t> *)&bundle_loc_1);
                QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>
                ::~QStringBuilder((QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>
                                   *)&MD_flag);
                QArrayDataPointer<char16_t>::~QArrayDataPointer
                          ((QArrayDataPointer<char16_t> *)&local_730);
                QArrayDataPointer<char16_t>::~QArrayDataPointer
                          ((QArrayDataPointer<char16_t> *)&local_768);
                QArrayDataPointer<char16_t>::~QArrayDataPointer
                          ((QArrayDataPointer<char16_t> *)&bundle_loc.m_string.d.ptr);
                QArrayDataPointer<char16_t>::~QArrayDataPointer
                          ((QArrayDataPointer<char16_t> *)((long)&local_4a8.a.a.a.a.a + 8));
                QArrayDataPointer<char16_t>::~QArrayDataPointer
                          ((QArrayDataPointer<char16_t> *)&local_680);
                QArrayDataPointer<char16_t>::~QArrayDataPointer
                          ((QArrayDataPointer<char16_t> *)&local_6f0);
                QArrayDataPointer<char16_t>::~QArrayDataPointer
                          ((QArrayDataPointer<char16_t> *)&soname);
                pQVar18 = *ppQVar1;
                QString::QString(&MD_flag.m_string,"lib_version_first");
                bVar7 = QMakeProject::isActiveConfig(pQVar18,&MD_flag.m_string,false);
                QArrayDataPointer<char16_t>::~QArrayDataPointer
                          ((QArrayDataPointer<char16_t> *)&MD_flag);
                pQVar18 = *ppQVar1;
                if (bVar7) {
                  ProKey::ProKey((ProKey *)&local_680,"TARGET_x");
                  pQVar9 = &QMakeEvaluator::valuesRef
                                      (&pQVar18->super_QMakeEvaluator,(ProKey *)&local_680)->
                            super_QList<ProString>;
                  pQVar18 = *ppQVar1;
                  ProKey::ProKey((ProKey *)&local_768,"TARGET");
                  QMakeEvaluator::first
                            ((ProString *)&local_730,&pQVar18->super_QMakeEvaluator,
                             (ProKey *)&local_768);
                  bundle_loc_1.m_string.d.d = (Data *)0x222550;
                  ProString::ProString
                            ((ProString *)&bundle_loc_1.m_string.d.ptr,(ProString *)&local_730);
                  QStringBuilder<const_char_(&)[4],_ProString>::QStringBuilder
                            ((QStringBuilder<const_char_(&)[4],_ProString> *)&soname,
                             (QStringBuilder<const_char_(&)[4],_ProString> *)&bundle_loc_1);
                  pQVar18 = *ppQVar1;
                  ProKey::ProKey((ProKey *)&local_98,"VER_MAJ");
                  QMakeEvaluator::first
                            (&local_68,&pQVar18->super_QMakeEvaluator,(ProKey *)&local_98);
                  QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>
                  ::QStringBuilder((QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>
                                    *)&local_4a8,
                                   (QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>
                                    *)&soname,&local_68);
                  QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>
                  ::QStringBuilder((QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>
                                    *)&bundle_loc,
                                   (QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>
                                    *)&local_4a8);
                  pQVar18 = *ppQVar1;
                  ProKey::ProKey((ProKey *)&local_f8,"QMAKE_EXTENSION_SHLIB");
                  QMakeEvaluator::first
                            (&local_c8,&pQVar18->super_QMakeEvaluator,(ProKey *)&local_f8);
                  QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>
                  ::QStringBuilder((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>
                                    *)&MD_flag,
                                   (QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>
                                    *)&bundle_loc,&local_c8);
                  ProString::
                  ProString<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<char_const(&)[4],ProString>,char_const(&)[2]>,ProString>,char_const(&)[2]>,ProString>
                            ((ProString *)&local_6f0,
                             (QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>
                              *)&MD_flag);
                  QList<ProString>::emplaceBack<ProString>(pQVar9,(ProString *)&local_6f0);
                  QArrayDataPointer<char16_t>::~QArrayDataPointer
                            ((QArrayDataPointer<char16_t> *)&local_6f0);
                  QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>
                  ::~QStringBuilder((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>
                                     *)&MD_flag);
                  QArrayDataPointer<char16_t>::~QArrayDataPointer
                            ((QArrayDataPointer<char16_t> *)&local_c8);
                  QArrayDataPointer<char16_t>::~QArrayDataPointer
                            ((QArrayDataPointer<char16_t> *)&local_f8);
                  QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>
                  ::~QStringBuilder((QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>
                                     *)&bundle_loc);
                  QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>
                  ::~QStringBuilder((QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>
                                     *)&local_4a8);
                  QArrayDataPointer<char16_t>::~QArrayDataPointer
                            ((QArrayDataPointer<char16_t> *)&local_68);
                  QArrayDataPointer<char16_t>::~QArrayDataPointer
                            ((QArrayDataPointer<char16_t> *)&local_98);
                  QArrayDataPointer<char16_t>::~QArrayDataPointer
                            ((QArrayDataPointer<char16_t> *)&soname.m_string.d.ptr);
                  QArrayDataPointer<char16_t>::~QArrayDataPointer
                            ((QArrayDataPointer<char16_t> *)&bundle_loc_1.m_string.d.ptr);
                  QArrayDataPointer<char16_t>::~QArrayDataPointer
                            ((QArrayDataPointer<char16_t> *)&local_730);
                  QArrayDataPointer<char16_t>::~QArrayDataPointer
                            ((QArrayDataPointer<char16_t> *)&local_768);
                  QArrayDataPointer<char16_t>::~QArrayDataPointer
                            ((QArrayDataPointer<char16_t> *)&local_680);
                  pQVar18 = *ppQVar1;
                  ProKey::ProKey((ProKey *)&local_730,"TARGET_x.y");
                  pQVar9 = &QMakeEvaluator::valuesRef
                                      (&pQVar18->super_QMakeEvaluator,(ProKey *)&local_730)->
                            super_QList<ProString>;
                  pQVar18 = *ppQVar1;
                  ProKey::ProKey((ProKey *)&local_98,"TARGET");
                  QMakeEvaluator::first
                            (&local_68,&pQVar18->super_QMakeEvaluator,(ProKey *)&local_98);
                  local_6f0.a.a.a = (char (*) [4])0x222550;
                  ProString::ProString(&local_6f0.a.a.b,&local_68);
                  QStringBuilder<const_char_(&)[4],_ProString>::QStringBuilder
                            ((QStringBuilder<const_char_(&)[4],_ProString> *)&local_680,
                             (QStringBuilder<const_char_(&)[4],_ProString> *)&local_6f0);
                  local_680.a.a.b = (char (*) [2])0x2252f2;
                  pQVar18 = *ppQVar1;
                  ProKey::ProKey((ProKey *)&local_f8,"VER_MAJ");
                  QMakeEvaluator::first
                            (&local_c8,&pQVar18->super_QMakeEvaluator,(ProKey *)&local_f8);
                  QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>
                  ::QStringBuilder((QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>
                                    *)&bundle_loc_1,
                                   (QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>
                                    *)&local_680,&local_c8);
                  QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>
                  ::QStringBuilder((QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>
                                    *)&soname,
                                   (QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>
                                    *)&bundle_loc_1);
                  pQVar18 = *ppQVar1;
                  ProKey::ProKey(&local_158,"VER_MIN");
                  QMakeEvaluator::first(&local_128,&pQVar18->super_QMakeEvaluator,&local_158);
                  QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>
                  ::QStringBuilder((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>
                                    *)&local_4a8,
                                   (QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>
                                    *)&soname,&local_128);
                  QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>
                  ::QStringBuilder((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>
                                    *)&bundle_loc,
                                   (QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>
                                    *)&local_4a8);
                  pQVar18 = *ppQVar1;
                  ProKey::ProKey(&local_1b8,"QMAKE_EXTENSION_SHLIB");
                  QMakeEvaluator::first(&local_188,&pQVar18->super_QMakeEvaluator,&local_1b8);
                  QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>
                  ::QStringBuilder((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>
                                    *)&MD_flag,
                                   (QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>
                                    *)&bundle_loc,&local_188);
                  ProString::
                  ProString<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<char_const(&)[4],ProString>,char_const(&)[2]>,ProString>,char_const(&)[2]>,ProString>,char_const(&)[2]>,ProString>
                            ((ProString *)&local_768,
                             (QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>
                              *)&MD_flag);
                  QList<ProString>::emplaceBack<ProString>(pQVar9,(ProString *)&local_768);
                  QArrayDataPointer<char16_t>::~QArrayDataPointer
                            ((QArrayDataPointer<char16_t> *)&local_768);
                  QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>
                  ::~QStringBuilder((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>
                                     *)&MD_flag);
                  QArrayDataPointer<char16_t>::~QArrayDataPointer
                            ((QArrayDataPointer<char16_t> *)&local_188);
                  QArrayDataPointer<char16_t>::~QArrayDataPointer
                            ((QArrayDataPointer<char16_t> *)&local_1b8);
                  QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>
                  ::~QStringBuilder((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>
                                     *)&bundle_loc);
                  QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>
                  ::~QStringBuilder((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>
                                     *)&local_4a8);
                  QArrayDataPointer<char16_t>::~QArrayDataPointer
                            ((QArrayDataPointer<char16_t> *)&local_128);
                  QArrayDataPointer<char16_t>::~QArrayDataPointer
                            ((QArrayDataPointer<char16_t> *)&local_158);
                  QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>
                  ::~QStringBuilder((QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>
                                     *)&soname);
                  QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>
                  ::~QStringBuilder((QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>
                                     *)&bundle_loc_1);
                  QArrayDataPointer<char16_t>::~QArrayDataPointer
                            ((QArrayDataPointer<char16_t> *)&local_c8);
                  QArrayDataPointer<char16_t>::~QArrayDataPointer
                            ((QArrayDataPointer<char16_t> *)&local_f8);
                  QArrayDataPointer<char16_t>::~QArrayDataPointer
                            ((QArrayDataPointer<char16_t> *)&local_680.a.a.a.b);
                  QArrayDataPointer<char16_t>::~QArrayDataPointer
                            ((QArrayDataPointer<char16_t> *)&local_6f0.a.a.b);
                  QArrayDataPointer<char16_t>::~QArrayDataPointer
                            ((QArrayDataPointer<char16_t> *)&local_68);
                  QArrayDataPointer<char16_t>::~QArrayDataPointer
                            ((QArrayDataPointer<char16_t> *)&local_98);
                  QArrayDataPointer<char16_t>::~QArrayDataPointer
                            ((QArrayDataPointer<char16_t> *)&local_730);
                  pQVar18 = *ppQVar1;
                  ProKey::ProKey((ProKey *)&local_68,"TARGET_x.y.z");
                  pQVar9 = &QMakeEvaluator::valuesRef
                                      (&pQVar18->super_QMakeEvaluator,(ProKey *)&local_68)->
                            super_QList<ProString>;
                  pQVar18 = *ppQVar1;
                  ProKey::ProKey((ProKey *)&local_f8,"TARGET");
                  QMakeEvaluator::first
                            (&local_c8,&pQVar18->super_QMakeEvaluator,(ProKey *)&local_f8);
                  local_768.a = (char (*) [4])0x222550;
                  ProString::ProString(&local_768.b,&local_c8);
                  QStringBuilder<const_char_(&)[4],_ProString>::QStringBuilder
                            (&local_730.a,&local_768);
                  local_730.b = (char (*) [2])0x2252f2;
                  pQVar18 = *ppQVar1;
                  ProKey::ProKey(&local_158,"VER_MAJ");
                  QMakeEvaluator::first(&local_128,&pQVar18->super_QMakeEvaluator,&local_158);
                  QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>
                  ::QStringBuilder(&local_6f0,&local_730,&local_128);
                  QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>
                  ::QStringBuilder(&local_680.a,&local_6f0);
                  local_680.b = (char (*) [2])0x2252f2;
                  pQVar18 = *ppQVar1;
                  ProKey::ProKey(&local_1b8,"VER_MIN");
                  QMakeEvaluator::first(&local_188,&pQVar18->super_QMakeEvaluator,&local_1b8);
                  QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>
                  ::QStringBuilder((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>
                                    *)&bundle_loc_1,&local_680,&local_188);
                  QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>
                  ::QStringBuilder((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>
                                    *)&soname,
                                   (QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>
                                    *)&bundle_loc_1);
                  pQVar18 = *ppQVar1;
                  ProKey::ProKey(&local_7c8,"VER_PAT");
                  QMakeEvaluator::first(&local_798,&pQVar18->super_QMakeEvaluator,&local_7c8);
                  QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>
                  ::QStringBuilder(&local_4a8,
                                   (QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>
                                    *)&soname,&local_798);
                  QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>
                  ::QStringBuilder((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>
                                    *)&bundle_loc,&local_4a8);
                  pQVar18 = *ppQVar1;
                  ProKey::ProKey(&local_828,"QMAKE_EXTENSION_SHLIB");
                  QMakeEvaluator::first(&local_7f8,&pQVar18->super_QMakeEvaluator,&local_828);
                  QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>
                  ::QStringBuilder((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>
                                    *)&MD_flag,
                                   (QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>
                                    *)&bundle_loc,&local_7f8);
                  ProString::
                  ProString<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<char_const(&)[4],ProString>,char_const(&)[2]>,ProString>,char_const(&)[2]>,ProString>,char_const(&)[2]>,ProString>,char_const(&)[2]>,ProString>
                            (&local_98,
                             (QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>
                              *)&MD_flag);
                  QList<ProString>::emplaceBack<ProString>(pQVar9,&local_98);
                  QArrayDataPointer<char16_t>::~QArrayDataPointer
                            ((QArrayDataPointer<char16_t> *)&local_98);
                  QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>
                  ::~QStringBuilder((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>
                                     *)&MD_flag);
                }
                else {
                  ProKey::ProKey((ProKey *)&local_680,"TARGET_x");
                  pQVar9 = &QMakeEvaluator::valuesRef
                                      (&pQVar18->super_QMakeEvaluator,(ProKey *)&local_680)->
                            super_QList<ProString>;
                  pQVar18 = *ppQVar1;
                  ProKey::ProKey((ProKey *)&local_768,"TARGET");
                  QMakeEvaluator::first
                            ((ProString *)&local_730,&pQVar18->super_QMakeEvaluator,
                             (ProKey *)&local_768);
                  bundle_loc_1.m_string.d.d = (Data *)0x222550;
                  ProString::ProString
                            ((ProString *)&bundle_loc_1.m_string.d.ptr,(ProString *)&local_730);
                  QStringBuilder<const_char_(&)[4],_ProString>::QStringBuilder
                            ((QStringBuilder<const_char_(&)[4],_ProString> *)&soname,
                             (QStringBuilder<const_char_(&)[4],_ProString> *)&bundle_loc_1);
                  pQVar18 = *ppQVar1;
                  ProKey::ProKey((ProKey *)&local_98,"QMAKE_EXTENSION_SHLIB");
                  QMakeEvaluator::first
                            (&local_68,&pQVar18->super_QMakeEvaluator,(ProKey *)&local_98);
                  QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>
                  ::QStringBuilder((QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>
                                    *)&local_4a8,
                                   (QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>
                                    *)&soname,&local_68);
                  QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>
                  ::QStringBuilder((QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>
                                    *)&bundle_loc,
                                   (QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>
                                    *)&local_4a8);
                  pQVar18 = *ppQVar1;
                  ProKey::ProKey((ProKey *)&local_f8,"VER_MAJ");
                  QMakeEvaluator::first
                            (&local_c8,&pQVar18->super_QMakeEvaluator,(ProKey *)&local_f8);
                  QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>
                  ::QStringBuilder((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>
                                    *)&MD_flag,
                                   (QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>
                                    *)&bundle_loc,&local_c8);
                  ProString::
                  ProString<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<char_const(&)[4],ProString>,char_const(&)[2]>,ProString>,char_const(&)[2]>,ProString>
                            ((ProString *)&local_6f0,
                             (QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>
                              *)&MD_flag);
                  QList<ProString>::emplaceBack<ProString>(pQVar9,(ProString *)&local_6f0);
                  QArrayDataPointer<char16_t>::~QArrayDataPointer
                            ((QArrayDataPointer<char16_t> *)&local_6f0);
                  QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>
                  ::~QStringBuilder((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>
                                     *)&MD_flag);
                  QArrayDataPointer<char16_t>::~QArrayDataPointer
                            ((QArrayDataPointer<char16_t> *)&local_c8);
                  QArrayDataPointer<char16_t>::~QArrayDataPointer
                            ((QArrayDataPointer<char16_t> *)&local_f8);
                  QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>
                  ::~QStringBuilder((QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>
                                     *)&bundle_loc);
                  QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>
                  ::~QStringBuilder((QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>
                                     *)&local_4a8);
                  QArrayDataPointer<char16_t>::~QArrayDataPointer
                            ((QArrayDataPointer<char16_t> *)&local_68);
                  QArrayDataPointer<char16_t>::~QArrayDataPointer
                            ((QArrayDataPointer<char16_t> *)&local_98);
                  QArrayDataPointer<char16_t>::~QArrayDataPointer
                            ((QArrayDataPointer<char16_t> *)&soname.m_string.d.ptr);
                  QArrayDataPointer<char16_t>::~QArrayDataPointer
                            ((QArrayDataPointer<char16_t> *)&bundle_loc_1.m_string.d.ptr);
                  QArrayDataPointer<char16_t>::~QArrayDataPointer
                            ((QArrayDataPointer<char16_t> *)&local_730);
                  QArrayDataPointer<char16_t>::~QArrayDataPointer
                            ((QArrayDataPointer<char16_t> *)&local_768);
                  QArrayDataPointer<char16_t>::~QArrayDataPointer
                            ((QArrayDataPointer<char16_t> *)&local_680);
                  pQVar18 = *ppQVar1;
                  ProKey::ProKey((ProKey *)&local_730,"TARGET_x.y");
                  pQVar9 = &QMakeEvaluator::valuesRef
                                      (&pQVar18->super_QMakeEvaluator,(ProKey *)&local_730)->
                            super_QList<ProString>;
                  pQVar18 = *ppQVar1;
                  ProKey::ProKey((ProKey *)&local_98,"TARGET");
                  QMakeEvaluator::first
                            (&local_68,&pQVar18->super_QMakeEvaluator,(ProKey *)&local_98);
                  local_6f0.a.a.a = (char (*) [4])0x222550;
                  ProString::ProString(&local_6f0.a.a.b,&local_68);
                  QStringBuilder<const_char_(&)[4],_ProString>::QStringBuilder
                            ((QStringBuilder<const_char_(&)[4],_ProString> *)&local_680,
                             (QStringBuilder<const_char_(&)[4],_ProString> *)&local_6f0);
                  local_680.a.a.b = (char (*) [2])0x2252f2;
                  pQVar18 = *ppQVar1;
                  ProKey::ProKey((ProKey *)&local_f8,"QMAKE_EXTENSION_SHLIB");
                  QMakeEvaluator::first
                            (&local_c8,&pQVar18->super_QMakeEvaluator,(ProKey *)&local_f8);
                  QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>
                  ::QStringBuilder((QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>
                                    *)&bundle_loc_1,
                                   (QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>
                                    *)&local_680,&local_c8);
                  QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>
                  ::QStringBuilder((QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>
                                    *)&soname,
                                   (QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>
                                    *)&bundle_loc_1);
                  pQVar18 = *ppQVar1;
                  ProKey::ProKey(&local_158,"VER_MAJ");
                  QMakeEvaluator::first(&local_128,&pQVar18->super_QMakeEvaluator,&local_158);
                  QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>
                  ::QStringBuilder((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>
                                    *)&local_4a8,
                                   (QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>
                                    *)&soname,&local_128);
                  QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>
                  ::QStringBuilder((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>
                                    *)&bundle_loc,
                                   (QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>
                                    *)&local_4a8);
                  pQVar18 = *ppQVar1;
                  ProKey::ProKey(&local_1b8,"VER_MIN");
                  QMakeEvaluator::first(&local_188,&pQVar18->super_QMakeEvaluator,&local_1b8);
                  QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>
                  ::QStringBuilder((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>
                                    *)&MD_flag,
                                   (QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>
                                    *)&bundle_loc,&local_188);
                  ProString::
                  ProString<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<char_const(&)[4],ProString>,char_const(&)[2]>,ProString>,char_const(&)[2]>,ProString>,char_const(&)[2]>,ProString>
                            ((ProString *)&local_768,
                             (QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>
                              *)&MD_flag);
                  QList<ProString>::emplaceBack<ProString>(pQVar9,(ProString *)&local_768);
                  QArrayDataPointer<char16_t>::~QArrayDataPointer
                            ((QArrayDataPointer<char16_t> *)&local_768);
                  QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>
                  ::~QStringBuilder((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>
                                     *)&MD_flag);
                  QArrayDataPointer<char16_t>::~QArrayDataPointer
                            ((QArrayDataPointer<char16_t> *)&local_188);
                  QArrayDataPointer<char16_t>::~QArrayDataPointer
                            ((QArrayDataPointer<char16_t> *)&local_1b8);
                  QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>
                  ::~QStringBuilder((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>
                                     *)&bundle_loc);
                  QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>
                  ::~QStringBuilder((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>
                                     *)&local_4a8);
                  QArrayDataPointer<char16_t>::~QArrayDataPointer
                            ((QArrayDataPointer<char16_t> *)&local_128);
                  QArrayDataPointer<char16_t>::~QArrayDataPointer
                            ((QArrayDataPointer<char16_t> *)&local_158);
                  QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>
                  ::~QStringBuilder((QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>
                                     *)&soname);
                  QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>
                  ::~QStringBuilder((QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>
                                     *)&bundle_loc_1);
                  QArrayDataPointer<char16_t>::~QArrayDataPointer
                            ((QArrayDataPointer<char16_t> *)&local_c8);
                  QArrayDataPointer<char16_t>::~QArrayDataPointer
                            ((QArrayDataPointer<char16_t> *)&local_f8);
                  QArrayDataPointer<char16_t>::~QArrayDataPointer
                            ((QArrayDataPointer<char16_t> *)&local_680.a.a.a.b);
                  QArrayDataPointer<char16_t>::~QArrayDataPointer
                            ((QArrayDataPointer<char16_t> *)&local_6f0.a.a.b);
                  QArrayDataPointer<char16_t>::~QArrayDataPointer
                            ((QArrayDataPointer<char16_t> *)&local_68);
                  QArrayDataPointer<char16_t>::~QArrayDataPointer
                            ((QArrayDataPointer<char16_t> *)&local_98);
                  QArrayDataPointer<char16_t>::~QArrayDataPointer
                            ((QArrayDataPointer<char16_t> *)&local_730);
                  pQVar18 = *ppQVar1;
                  ProKey::ProKey((ProKey *)&local_68,"TARGET_x.y.z");
                  pQVar9 = &QMakeEvaluator::valuesRef
                                      (&pQVar18->super_QMakeEvaluator,(ProKey *)&local_68)->
                            super_QList<ProString>;
                  pQVar18 = *ppQVar1;
                  ProKey::ProKey((ProKey *)&local_f8,"TARGET");
                  QMakeEvaluator::first
                            (&local_c8,&pQVar18->super_QMakeEvaluator,(ProKey *)&local_f8);
                  local_768.a = (char (*) [4])0x222550;
                  ProString::ProString(&local_768.b,&local_c8);
                  QStringBuilder<const_char_(&)[4],_ProString>::QStringBuilder
                            (&local_730.a,&local_768);
                  local_730.b = (char (*) [2])0x2252f2;
                  pQVar18 = *ppQVar1;
                  ProKey::ProKey(&local_158,"QMAKE_EXTENSION_SHLIB");
                  QMakeEvaluator::first(&local_128,&pQVar18->super_QMakeEvaluator,&local_158);
                  QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>
                  ::QStringBuilder(&local_6f0,&local_730,&local_128);
                  QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>
                  ::QStringBuilder(&local_680.a,&local_6f0);
                  local_680.b = (char (*) [2])0x2252f2;
                  pQVar18 = *ppQVar1;
                  ProKey::ProKey(&local_1b8,"VER_MAJ");
                  QMakeEvaluator::first(&local_188,&pQVar18->super_QMakeEvaluator,&local_1b8);
                  QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>
                  ::QStringBuilder((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>
                                    *)&bundle_loc_1,&local_680,&local_188);
                  QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>
                  ::QStringBuilder((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>
                                    *)&soname,
                                   (QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>
                                    *)&bundle_loc_1);
                  pQVar18 = *ppQVar1;
                  ProKey::ProKey(&local_7c8,"VER_MIN");
                  QMakeEvaluator::first(&local_798,&pQVar18->super_QMakeEvaluator,&local_7c8);
                  QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>
                  ::QStringBuilder(&local_4a8,
                                   (QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>
                                    *)&soname,&local_798);
                  QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>
                  ::QStringBuilder((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>
                                    *)&bundle_loc,&local_4a8);
                  pQVar18 = *ppQVar1;
                  ProKey::ProKey(&local_828,"VER_PAT");
                  QMakeEvaluator::first(&local_7f8,&pQVar18->super_QMakeEvaluator,&local_828);
                  QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>
                  ::QStringBuilder((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>
                                    *)&MD_flag,
                                   (QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>
                                    *)&bundle_loc,&local_7f8);
                  ProString::
                  ProString<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<char_const(&)[4],ProString>,char_const(&)[2]>,ProString>,char_const(&)[2]>,ProString>,char_const(&)[2]>,ProString>,char_const(&)[2]>,ProString>
                            (&local_98,
                             (QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>
                              *)&MD_flag);
                  QList<ProString>::emplaceBack<ProString>(pQVar9,&local_98);
                  QArrayDataPointer<char16_t>::~QArrayDataPointer
                            ((QArrayDataPointer<char16_t> *)&local_98);
                  QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>
                  ::~QStringBuilder((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>
                                     *)&MD_flag);
                }
                QArrayDataPointer<char16_t>::~QArrayDataPointer
                          ((QArrayDataPointer<char16_t> *)&local_7f8);
                QArrayDataPointer<char16_t>::~QArrayDataPointer
                          ((QArrayDataPointer<char16_t> *)&local_828);
                QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>
                ::~QStringBuilder((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>
                                   *)&bundle_loc);
                QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>
                ::~QStringBuilder(&local_4a8);
                QArrayDataPointer<char16_t>::~QArrayDataPointer
                          ((QArrayDataPointer<char16_t> *)&local_798);
                QArrayDataPointer<char16_t>::~QArrayDataPointer
                          ((QArrayDataPointer<char16_t> *)&local_7c8);
                QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>
                ::~QStringBuilder((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>
                                   *)&soname);
                QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>
                ::~QStringBuilder((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>
                                   *)&bundle_loc_1);
                QArrayDataPointer<char16_t>::~QArrayDataPointer
                          ((QArrayDataPointer<char16_t> *)&local_188);
                QArrayDataPointer<char16_t>::~QArrayDataPointer
                          ((QArrayDataPointer<char16_t> *)&local_1b8);
                QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>
                ::~QStringBuilder(&local_680.a);
                QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>
                ::~QStringBuilder(&local_6f0);
                QArrayDataPointer<char16_t>::~QArrayDataPointer
                          ((QArrayDataPointer<char16_t> *)&local_128);
                QArrayDataPointer<char16_t>::~QArrayDataPointer
                          ((QArrayDataPointer<char16_t> *)&local_158);
                QArrayDataPointer<char16_t>::~QArrayDataPointer
                          ((QArrayDataPointer<char16_t> *)&local_730.a.b);
                QArrayDataPointer<char16_t>::~QArrayDataPointer
                          ((QArrayDataPointer<char16_t> *)&local_768.b);
                QArrayDataPointer<char16_t>::~QArrayDataPointer
                          ((QArrayDataPointer<char16_t> *)&local_c8);
                QArrayDataPointer<char16_t>::~QArrayDataPointer
                          ((QArrayDataPointer<char16_t> *)&local_f8);
                QArrayDataPointer<char16_t>::~QArrayDataPointer
                          ((QArrayDataPointer<char16_t> *)&local_68);
                pQVar18 = *ppQVar1;
                QString::QString(&MD_flag.m_string,"unversioned_libname");
                bVar7 = QMakeProject::isActiveConfig(pQVar18,&MD_flag.m_string,false);
                QArrayDataPointer<char16_t>::~QArrayDataPointer
                          ((QArrayDataPointer<char16_t> *)&MD_flag);
                pQVar18 = *ppQVar1;
                if (bVar7) {
                  pcVar19 = "TARGET_";
                  goto LAB_0019601b;
                }
              }
              else {
                ProKey::ProKey((ProKey *)&bundle_loc,"PRL_TARGET");
                pQVar9 = &QMakeEvaluator::valuesRef
                                    (&pQVar18->super_QMakeEvaluator,(ProKey *)&bundle_loc)->
                          super_QList<ProString>;
                pQVar18 = *ppQVar1;
                ProKey::ProKey((ProKey *)&bundle_loc_1,"TARGET");
                QMakeEvaluator::first
                          (&soname,&pQVar18->super_QMakeEvaluator,(ProKey *)&bundle_loc_1);
                ppcVar2 = &MD_flag.m_string.d.ptr;
                MD_flag.m_string.d.d = (Data *)0x222550;
                ProString::ProString((ProString *)ppcVar2,&soname);
                ProString::ProString<char_const(&)[4],ProString>
                          ((ProString *)&local_4a8,
                           (QStringBuilder<const_char_(&)[4],_ProString> *)&MD_flag);
                QList<ProString>::emplaceFront<ProString>(pQVar9,(ProString *)&local_4a8);
                QArrayDataPointer<char16_t>::~QArrayDataPointer
                          ((QArrayDataPointer<char16_t> *)&local_4a8);
                QArrayDataPointer<char16_t>::~QArrayDataPointer
                          ((QArrayDataPointer<char16_t> *)ppcVar2);
                QArrayDataPointer<char16_t>::~QArrayDataPointer
                          ((QArrayDataPointer<char16_t> *)&soname);
                QArrayDataPointer<char16_t>::~QArrayDataPointer
                          ((QArrayDataPointer<char16_t> *)&bundle_loc_1);
                QArrayDataPointer<char16_t>::~QArrayDataPointer
                          ((QArrayDataPointer<char16_t> *)&bundle_loc);
                pQVar18 = *ppQVar1;
                ProKey::ProKey((ProKey *)&soname,"TARGET_");
                pQVar9 = &QMakeEvaluator::valuesRef
                                    (&pQVar18->super_QMakeEvaluator,(ProKey *)&soname)->
                          super_QList<ProString>;
                pQVar18 = *ppQVar1;
                ProKey::ProKey((ProKey *)&local_6f0,"QMAKE_PREFIX_STATICLIB");
                QMakeEvaluator::first
                          ((ProString *)&local_680,&pQVar18->super_QMakeEvaluator,
                           (ProKey *)&local_6f0);
                pQVar18 = *ppQVar1;
                ProKey::ProKey((ProKey *)&local_768,"TARGET");
                QMakeEvaluator::first
                          ((ProString *)&local_730,&pQVar18->super_QMakeEvaluator,
                           (ProKey *)&local_768);
                QStringBuilder<ProString,_ProString>::QStringBuilder
                          ((QStringBuilder<ProString,_ProString> *)&local_4a8,
                           (ProString *)&local_680,(ProString *)&local_730);
                QStringBuilder<ProString,_ProString>::QStringBuilder
                          ((QStringBuilder<ProString,_ProString> *)&bundle_loc,
                           (QStringBuilder<ProString,_ProString> *)&local_4a8);
                pQVar18 = *ppQVar1;
                ProKey::ProKey((ProKey *)&local_98,"QMAKE_EXTENSION_STATICLIB");
                QMakeEvaluator::first(&local_68,&pQVar18->super_QMakeEvaluator,(ProKey *)&local_98);
                QStringBuilder<QStringBuilder<QStringBuilder<ProString,_ProString>,_const_char_(&)[2]>,_ProString>
                ::QStringBuilder((QStringBuilder<QStringBuilder<QStringBuilder<ProString,_ProString>,_const_char_(&)[2]>,_ProString>
                                  *)&MD_flag,
                                 (QStringBuilder<QStringBuilder<ProString,_ProString>,_const_char_(&)[2]>
                                  *)&bundle_loc,&local_68);
                ProString::
                ProString<QStringBuilder<QStringBuilder<ProString,ProString>,char_const(&)[2]>,ProString>
                          (&bundle_loc_1,
                           (QStringBuilder<QStringBuilder<QStringBuilder<ProString,_ProString>,_const_char_(&)[2]>,_ProString>
                            *)&MD_flag);
                QList<ProString>::emplaceBack<ProString>(pQVar9,&bundle_loc_1);
                QArrayDataPointer<char16_t>::~QArrayDataPointer
                          ((QArrayDataPointer<char16_t> *)&bundle_loc_1);
                QStringBuilder<QStringBuilder<QStringBuilder<ProString,_ProString>,_const_char_(&)[2]>,_ProString>
                ::~QStringBuilder((QStringBuilder<QStringBuilder<QStringBuilder<ProString,_ProString>,_const_char_(&)[2]>,_ProString>
                                   *)&MD_flag);
                QArrayDataPointer<char16_t>::~QArrayDataPointer
                          ((QArrayDataPointer<char16_t> *)&local_68);
                QArrayDataPointer<char16_t>::~QArrayDataPointer
                          ((QArrayDataPointer<char16_t> *)&local_98);
                QStringBuilder<ProString,_ProString>::~QStringBuilder
                          ((QStringBuilder<ProString,_ProString> *)&bundle_loc);
                QStringBuilder<ProString,_ProString>::~QStringBuilder
                          ((QStringBuilder<ProString,_ProString> *)&local_4a8);
                QArrayDataPointer<char16_t>::~QArrayDataPointer
                          ((QArrayDataPointer<char16_t> *)&local_730);
                QArrayDataPointer<char16_t>::~QArrayDataPointer
                          ((QArrayDataPointer<char16_t> *)&local_768);
                QArrayDataPointer<char16_t>::~QArrayDataPointer
                          ((QArrayDataPointer<char16_t> *)&local_680);
                QArrayDataPointer<char16_t>::~QArrayDataPointer
                          ((QArrayDataPointer<char16_t> *)&local_6f0);
                QArrayDataPointer<char16_t>::~QArrayDataPointer
                          ((QArrayDataPointer<char16_t> *)&soname);
                pQVar18 = *ppQVar1;
                QString::QString(&MD_flag.m_string,"lib_version_first");
                bVar7 = QMakeProject::isActiveConfig(pQVar18,&MD_flag.m_string,false);
                QArrayDataPointer<char16_t>::~QArrayDataPointer
                          ((QArrayDataPointer<char16_t> *)&MD_flag);
                pQVar18 = *ppQVar1;
                if (bVar7) {
                  ProKey::ProKey((ProKey *)&local_680,"TARGET_x");
                  pQVar9 = &QMakeEvaluator::valuesRef
                                      (&pQVar18->super_QMakeEvaluator,(ProKey *)&local_680)->
                            super_QList<ProString>;
                  pQVar18 = *ppQVar1;
                  ProKey::ProKey((ProKey *)&local_768,"TARGET");
                  QMakeEvaluator::first
                            ((ProString *)&local_730,&pQVar18->super_QMakeEvaluator,
                             (ProKey *)&local_768);
                  bundle_loc_1.m_string.d.d = (Data *)0x222550;
                  ProString::ProString
                            ((ProString *)&bundle_loc_1.m_string.d.ptr,(ProString *)&local_730);
                  QStringBuilder<const_char_(&)[4],_ProString>::QStringBuilder
                            ((QStringBuilder<const_char_(&)[4],_ProString> *)&soname,
                             (QStringBuilder<const_char_(&)[4],_ProString> *)&bundle_loc_1);
                  pQVar18 = *ppQVar1;
                  ProKey::ProKey((ProKey *)&local_98,"VER_MAJ");
                  QMakeEvaluator::first
                            (&local_68,&pQVar18->super_QMakeEvaluator,(ProKey *)&local_98);
                  QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>
                  ::QStringBuilder((QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>
                                    *)&local_4a8,
                                   (QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>
                                    *)&soname,&local_68);
                  QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>
                  ::QStringBuilder((QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>
                                    *)&bundle_loc,
                                   (QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>
                                    *)&local_4a8);
                  pQVar18 = *ppQVar1;
                  ProKey::ProKey((ProKey *)&local_f8,"QMAKE_EXTENSION_SHLIB");
                  QMakeEvaluator::first
                            (&local_c8,&pQVar18->super_QMakeEvaluator,(ProKey *)&local_f8);
                  QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>
                  ::QStringBuilder((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>
                                    *)&MD_flag,
                                   (QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>
                                    *)&bundle_loc,&local_c8);
                  ProString::
                  ProString<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<char_const(&)[4],ProString>,char_const(&)[2]>,ProString>,char_const(&)[2]>,ProString>
                            ((ProString *)&local_6f0,
                             (QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>
                              *)&MD_flag);
                  QList<ProString>::emplaceBack<ProString>(pQVar9,(ProString *)&local_6f0);
                  QArrayDataPointer<char16_t>::~QArrayDataPointer
                            ((QArrayDataPointer<char16_t> *)&local_6f0);
                  QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>
                  ::~QStringBuilder((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>
                                     *)&MD_flag);
                  QArrayDataPointer<char16_t>::~QArrayDataPointer
                            ((QArrayDataPointer<char16_t> *)&local_c8);
                  QArrayDataPointer<char16_t>::~QArrayDataPointer
                            ((QArrayDataPointer<char16_t> *)&local_f8);
                  QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>
                  ::~QStringBuilder((QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>
                                     *)&bundle_loc);
                  QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>
                  ::~QStringBuilder((QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>
                                     *)&local_4a8);
                  QArrayDataPointer<char16_t>::~QArrayDataPointer
                            ((QArrayDataPointer<char16_t> *)&local_68);
                  QArrayDataPointer<char16_t>::~QArrayDataPointer
                            ((QArrayDataPointer<char16_t> *)&local_98);
                  QArrayDataPointer<char16_t>::~QArrayDataPointer
                            ((QArrayDataPointer<char16_t> *)&soname.m_string.d.ptr);
                  QArrayDataPointer<char16_t>::~QArrayDataPointer
                            ((QArrayDataPointer<char16_t> *)&bundle_loc_1.m_string.d.ptr);
                  QArrayDataPointer<char16_t>::~QArrayDataPointer
                            ((QArrayDataPointer<char16_t> *)&local_730);
                  QArrayDataPointer<char16_t>::~QArrayDataPointer
                            ((QArrayDataPointer<char16_t> *)&local_768);
                  QArrayDataPointer<char16_t>::~QArrayDataPointer
                            ((QArrayDataPointer<char16_t> *)&local_680);
                  pQVar18 = *ppQVar1;
                  ProKey::ProKey((ProKey *)&local_730,"TARGET_x.y");
                  pQVar9 = &QMakeEvaluator::valuesRef
                                      (&pQVar18->super_QMakeEvaluator,(ProKey *)&local_730)->
                            super_QList<ProString>;
                  pQVar18 = *ppQVar1;
                  ProKey::ProKey((ProKey *)&local_98,"TARGET");
                  QMakeEvaluator::first
                            (&local_68,&pQVar18->super_QMakeEvaluator,(ProKey *)&local_98);
                  local_6f0.a.a.a = (char (*) [4])0x222550;
                  ProString::ProString(&local_6f0.a.a.b,&local_68);
                  QStringBuilder<const_char_(&)[4],_ProString>::QStringBuilder
                            ((QStringBuilder<const_char_(&)[4],_ProString> *)&local_680,
                             (QStringBuilder<const_char_(&)[4],_ProString> *)&local_6f0);
                  local_680.a.a.b = (char (*) [2])0x2252f2;
                  pQVar18 = *ppQVar1;
                  ProKey::ProKey((ProKey *)&local_f8,"VER_MAJ");
                  QMakeEvaluator::first
                            (&local_c8,&pQVar18->super_QMakeEvaluator,(ProKey *)&local_f8);
                  QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>
                  ::QStringBuilder((QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>
                                    *)&bundle_loc_1,
                                   (QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>
                                    *)&local_680,&local_c8);
                  QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>
                  ::QStringBuilder((QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>
                                    *)&soname,
                                   (QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>
                                    *)&bundle_loc_1);
                  pQVar18 = *ppQVar1;
                  ProKey::ProKey(&local_158,"VER_MIN");
                  QMakeEvaluator::first(&local_128,&pQVar18->super_QMakeEvaluator,&local_158);
                  QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>
                  ::QStringBuilder((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>
                                    *)&local_4a8,
                                   (QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>
                                    *)&soname,&local_128);
                  QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>
                  ::QStringBuilder((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>
                                    *)&bundle_loc,
                                   (QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>
                                    *)&local_4a8);
                  pQVar18 = *ppQVar1;
                  ProKey::ProKey(&local_1b8,"QMAKE_EXTENSION_SHLIB");
                  QMakeEvaluator::first(&local_188,&pQVar18->super_QMakeEvaluator,&local_1b8);
                  QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>
                  ::QStringBuilder((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>
                                    *)&MD_flag,
                                   (QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>
                                    *)&bundle_loc,&local_188);
                  ProString::
                  ProString<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<char_const(&)[4],ProString>,char_const(&)[2]>,ProString>,char_const(&)[2]>,ProString>,char_const(&)[2]>,ProString>
                            ((ProString *)&local_768,
                             (QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>
                              *)&MD_flag);
                  QList<ProString>::emplaceBack<ProString>(pQVar9,(ProString *)&local_768);
                  QArrayDataPointer<char16_t>::~QArrayDataPointer
                            ((QArrayDataPointer<char16_t> *)&local_768);
                  QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>
                  ::~QStringBuilder((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>
                                     *)&MD_flag);
                  QArrayDataPointer<char16_t>::~QArrayDataPointer
                            ((QArrayDataPointer<char16_t> *)&local_188);
                  QArrayDataPointer<char16_t>::~QArrayDataPointer
                            ((QArrayDataPointer<char16_t> *)&local_1b8);
                  QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>
                  ::~QStringBuilder((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>
                                     *)&bundle_loc);
                  QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>
                  ::~QStringBuilder((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>
                                     *)&local_4a8);
                  QArrayDataPointer<char16_t>::~QArrayDataPointer
                            ((QArrayDataPointer<char16_t> *)&local_128);
                  QArrayDataPointer<char16_t>::~QArrayDataPointer
                            ((QArrayDataPointer<char16_t> *)&local_158);
                  QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>
                  ::~QStringBuilder((QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>
                                     *)&soname);
                  QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>
                  ::~QStringBuilder((QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>
                                     *)&bundle_loc_1);
                  QArrayDataPointer<char16_t>::~QArrayDataPointer
                            ((QArrayDataPointer<char16_t> *)&local_c8);
                  QArrayDataPointer<char16_t>::~QArrayDataPointer
                            ((QArrayDataPointer<char16_t> *)&local_f8);
                  QArrayDataPointer<char16_t>::~QArrayDataPointer
                            ((QArrayDataPointer<char16_t> *)&local_680.a.a.a.b);
                  QArrayDataPointer<char16_t>::~QArrayDataPointer
                            ((QArrayDataPointer<char16_t> *)&local_6f0.a.a.b);
                  QArrayDataPointer<char16_t>::~QArrayDataPointer
                            ((QArrayDataPointer<char16_t> *)&local_68);
                  QArrayDataPointer<char16_t>::~QArrayDataPointer
                            ((QArrayDataPointer<char16_t> *)&local_98);
                  QArrayDataPointer<char16_t>::~QArrayDataPointer
                            ((QArrayDataPointer<char16_t> *)&local_730);
                  pQVar18 = *ppQVar1;
                  ProKey::ProKey((ProKey *)&local_68,"TARGET_x.y.z");
                  pQVar9 = &QMakeEvaluator::valuesRef
                                      (&pQVar18->super_QMakeEvaluator,(ProKey *)&local_68)->
                            super_QList<ProString>;
                  pQVar18 = *ppQVar1;
                  ProKey::ProKey((ProKey *)&local_f8,"TARGET");
                  QMakeEvaluator::first
                            (&local_c8,&pQVar18->super_QMakeEvaluator,(ProKey *)&local_f8);
                  local_768.a = (char (*) [4])0x222550;
                  ProString::ProString(&local_768.b,&local_c8);
                  QStringBuilder<const_char_(&)[4],_ProString>::QStringBuilder
                            (&local_730.a,&local_768);
                  local_730.b = (char (*) [2])0x2252f2;
                  pQVar18 = *ppQVar1;
                  ProKey::ProKey(&local_158,"VER_MAJ");
                  QMakeEvaluator::first(&local_128,&pQVar18->super_QMakeEvaluator,&local_158);
                  QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>
                  ::QStringBuilder(&local_6f0,&local_730,&local_128);
                  QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>
                  ::QStringBuilder(&local_680.a,&local_6f0);
                  local_680.b = (char (*) [2])0x2252f2;
                  pQVar18 = *ppQVar1;
                  ProKey::ProKey(&local_1b8,"VER_MIN");
                  QMakeEvaluator::first(&local_188,&pQVar18->super_QMakeEvaluator,&local_1b8);
                  QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>
                  ::QStringBuilder((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>
                                    *)&bundle_loc_1,&local_680,&local_188);
                  QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>
                  ::QStringBuilder((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>
                                    *)&soname,
                                   (QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>
                                    *)&bundle_loc_1);
                  pQVar18 = *ppQVar1;
                  ProKey::ProKey(&local_7c8,"VER_PAT");
                  QMakeEvaluator::first(&local_798,&pQVar18->super_QMakeEvaluator,&local_7c8);
                  QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>
                  ::QStringBuilder(&local_4a8,
                                   (QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>
                                    *)&soname,&local_798);
                  QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>
                  ::QStringBuilder((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>
                                    *)&bundle_loc,&local_4a8);
                  pQVar18 = *ppQVar1;
                  ProKey::ProKey(&local_828,"QMAKE_EXTENSION_SHLIB");
                  QMakeEvaluator::first(&local_7f8,&pQVar18->super_QMakeEvaluator,&local_828);
                  QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>
                  ::QStringBuilder((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>
                                    *)&MD_flag,
                                   (QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>
                                    *)&bundle_loc,&local_7f8);
                  ProString::
                  ProString<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<char_const(&)[4],ProString>,char_const(&)[2]>,ProString>,char_const(&)[2]>,ProString>,char_const(&)[2]>,ProString>,char_const(&)[2]>,ProString>
                            (&local_98,
                             (QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>
                              *)&MD_flag);
                  QList<ProString>::emplaceBack<ProString>(pQVar9,&local_98);
                  QArrayDataPointer<char16_t>::~QArrayDataPointer
                            ((QArrayDataPointer<char16_t> *)&local_98);
                  QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>
                  ::~QStringBuilder((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>
                                     *)&MD_flag);
                }
                else {
                  ProKey::ProKey((ProKey *)&local_680,"TARGET_x");
                  pQVar9 = &QMakeEvaluator::valuesRef
                                      (&pQVar18->super_QMakeEvaluator,(ProKey *)&local_680)->
                            super_QList<ProString>;
                  pQVar18 = *ppQVar1;
                  ProKey::ProKey((ProKey *)&local_768,"TARGET");
                  QMakeEvaluator::first
                            ((ProString *)&local_730,&pQVar18->super_QMakeEvaluator,
                             (ProKey *)&local_768);
                  bundle_loc_1.m_string.d.d = (Data *)0x222550;
                  ProString::ProString
                            ((ProString *)&bundle_loc_1.m_string.d.ptr,(ProString *)&local_730);
                  QStringBuilder<const_char_(&)[4],_ProString>::QStringBuilder
                            ((QStringBuilder<const_char_(&)[4],_ProString> *)&soname,
                             (QStringBuilder<const_char_(&)[4],_ProString> *)&bundle_loc_1);
                  pQVar18 = *ppQVar1;
                  ProKey::ProKey((ProKey *)&local_98,"QMAKE_EXTENSION_SHLIB");
                  QMakeEvaluator::first
                            (&local_68,&pQVar18->super_QMakeEvaluator,(ProKey *)&local_98);
                  QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>
                  ::QStringBuilder((QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>
                                    *)&local_4a8,
                                   (QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>
                                    *)&soname,&local_68);
                  QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>
                  ::QStringBuilder((QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>
                                    *)&bundle_loc,
                                   (QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>
                                    *)&local_4a8);
                  pQVar18 = *ppQVar1;
                  ProKey::ProKey((ProKey *)&local_f8,"VER_MAJ");
                  QMakeEvaluator::first
                            (&local_c8,&pQVar18->super_QMakeEvaluator,(ProKey *)&local_f8);
                  QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>
                  ::QStringBuilder((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>
                                    *)&MD_flag,
                                   (QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>
                                    *)&bundle_loc,&local_c8);
                  ProString::
                  ProString<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<char_const(&)[4],ProString>,char_const(&)[2]>,ProString>,char_const(&)[2]>,ProString>
                            ((ProString *)&local_6f0,
                             (QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>
                              *)&MD_flag);
                  QList<ProString>::emplaceBack<ProString>(pQVar9,(ProString *)&local_6f0);
                  QArrayDataPointer<char16_t>::~QArrayDataPointer
                            ((QArrayDataPointer<char16_t> *)&local_6f0);
                  QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>
                  ::~QStringBuilder((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>
                                     *)&MD_flag);
                  QArrayDataPointer<char16_t>::~QArrayDataPointer
                            ((QArrayDataPointer<char16_t> *)&local_c8);
                  QArrayDataPointer<char16_t>::~QArrayDataPointer
                            ((QArrayDataPointer<char16_t> *)&local_f8);
                  QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>
                  ::~QStringBuilder((QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>
                                     *)&bundle_loc);
                  QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>
                  ::~QStringBuilder((QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>
                                     *)&local_4a8);
                  QArrayDataPointer<char16_t>::~QArrayDataPointer
                            ((QArrayDataPointer<char16_t> *)&local_68);
                  QArrayDataPointer<char16_t>::~QArrayDataPointer
                            ((QArrayDataPointer<char16_t> *)&local_98);
                  QArrayDataPointer<char16_t>::~QArrayDataPointer
                            ((QArrayDataPointer<char16_t> *)&soname.m_string.d.ptr);
                  QArrayDataPointer<char16_t>::~QArrayDataPointer
                            ((QArrayDataPointer<char16_t> *)&bundle_loc_1.m_string.d.ptr);
                  QArrayDataPointer<char16_t>::~QArrayDataPointer
                            ((QArrayDataPointer<char16_t> *)&local_730);
                  QArrayDataPointer<char16_t>::~QArrayDataPointer
                            ((QArrayDataPointer<char16_t> *)&local_768);
                  QArrayDataPointer<char16_t>::~QArrayDataPointer
                            ((QArrayDataPointer<char16_t> *)&local_680);
                  pQVar18 = *ppQVar1;
                  ProKey::ProKey((ProKey *)&local_730,"TARGET_x.y");
                  pQVar9 = &QMakeEvaluator::valuesRef
                                      (&pQVar18->super_QMakeEvaluator,(ProKey *)&local_730)->
                            super_QList<ProString>;
                  pQVar18 = *ppQVar1;
                  ProKey::ProKey((ProKey *)&local_98,"TARGET");
                  QMakeEvaluator::first
                            (&local_68,&pQVar18->super_QMakeEvaluator,(ProKey *)&local_98);
                  local_6f0.a.a.a = (char (*) [4])0x222550;
                  ProString::ProString(&local_6f0.a.a.b,&local_68);
                  QStringBuilder<const_char_(&)[4],_ProString>::QStringBuilder
                            ((QStringBuilder<const_char_(&)[4],_ProString> *)&local_680,
                             (QStringBuilder<const_char_(&)[4],_ProString> *)&local_6f0);
                  local_680.a.a.b = (char (*) [2])0x2252f2;
                  pQVar18 = *ppQVar1;
                  ProKey::ProKey((ProKey *)&local_f8,"QMAKE_EXTENSION_SHLIB");
                  QMakeEvaluator::first
                            (&local_c8,&pQVar18->super_QMakeEvaluator,(ProKey *)&local_f8);
                  QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>
                  ::QStringBuilder((QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>
                                    *)&bundle_loc_1,
                                   (QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>
                                    *)&local_680,&local_c8);
                  QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>
                  ::QStringBuilder((QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>
                                    *)&soname,
                                   (QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>
                                    *)&bundle_loc_1);
                  pQVar18 = *ppQVar1;
                  ProKey::ProKey(&local_158,"VER_MAJ");
                  QMakeEvaluator::first(&local_128,&pQVar18->super_QMakeEvaluator,&local_158);
                  QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>
                  ::QStringBuilder((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>
                                    *)&local_4a8,
                                   (QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>
                                    *)&soname,&local_128);
                  QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>
                  ::QStringBuilder((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>
                                    *)&bundle_loc,
                                   (QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>
                                    *)&local_4a8);
                  pQVar18 = *ppQVar1;
                  ProKey::ProKey(&local_1b8,"VER_MIN");
                  QMakeEvaluator::first(&local_188,&pQVar18->super_QMakeEvaluator,&local_1b8);
                  QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>
                  ::QStringBuilder((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>
                                    *)&MD_flag,
                                   (QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>
                                    *)&bundle_loc,&local_188);
                  ProString::
                  ProString<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<char_const(&)[4],ProString>,char_const(&)[2]>,ProString>,char_const(&)[2]>,ProString>,char_const(&)[2]>,ProString>
                            ((ProString *)&local_768,
                             (QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>
                              *)&MD_flag);
                  QList<ProString>::emplaceBack<ProString>(pQVar9,(ProString *)&local_768);
                  QArrayDataPointer<char16_t>::~QArrayDataPointer
                            ((QArrayDataPointer<char16_t> *)&local_768);
                  QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>
                  ::~QStringBuilder((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>
                                     *)&MD_flag);
                  QArrayDataPointer<char16_t>::~QArrayDataPointer
                            ((QArrayDataPointer<char16_t> *)&local_188);
                  QArrayDataPointer<char16_t>::~QArrayDataPointer
                            ((QArrayDataPointer<char16_t> *)&local_1b8);
                  QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>
                  ::~QStringBuilder((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>
                                     *)&bundle_loc);
                  QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>
                  ::~QStringBuilder((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>
                                     *)&local_4a8);
                  QArrayDataPointer<char16_t>::~QArrayDataPointer
                            ((QArrayDataPointer<char16_t> *)&local_128);
                  QArrayDataPointer<char16_t>::~QArrayDataPointer
                            ((QArrayDataPointer<char16_t> *)&local_158);
                  QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>
                  ::~QStringBuilder((QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>
                                     *)&soname);
                  QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>
                  ::~QStringBuilder((QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>
                                     *)&bundle_loc_1);
                  QArrayDataPointer<char16_t>::~QArrayDataPointer
                            ((QArrayDataPointer<char16_t> *)&local_c8);
                  QArrayDataPointer<char16_t>::~QArrayDataPointer
                            ((QArrayDataPointer<char16_t> *)&local_f8);
                  QArrayDataPointer<char16_t>::~QArrayDataPointer
                            ((QArrayDataPointer<char16_t> *)&local_680.a.a.a.b);
                  QArrayDataPointer<char16_t>::~QArrayDataPointer
                            ((QArrayDataPointer<char16_t> *)&local_6f0.a.a.b);
                  QArrayDataPointer<char16_t>::~QArrayDataPointer
                            ((QArrayDataPointer<char16_t> *)&local_68);
                  QArrayDataPointer<char16_t>::~QArrayDataPointer
                            ((QArrayDataPointer<char16_t> *)&local_98);
                  QArrayDataPointer<char16_t>::~QArrayDataPointer
                            ((QArrayDataPointer<char16_t> *)&local_730);
                  pQVar18 = *ppQVar1;
                  ProKey::ProKey((ProKey *)&local_68,"TARGET_x.y.z");
                  pQVar9 = &QMakeEvaluator::valuesRef
                                      (&pQVar18->super_QMakeEvaluator,(ProKey *)&local_68)->
                            super_QList<ProString>;
                  pQVar18 = *ppQVar1;
                  ProKey::ProKey((ProKey *)&local_f8,"TARGET");
                  QMakeEvaluator::first
                            (&local_c8,&pQVar18->super_QMakeEvaluator,(ProKey *)&local_f8);
                  local_768.a = (char (*) [4])0x222550;
                  ProString::ProString(&local_768.b,&local_c8);
                  QStringBuilder<const_char_(&)[4],_ProString>::QStringBuilder
                            (&local_730.a,&local_768);
                  local_730.b = (char (*) [2])0x2252f2;
                  pQVar18 = *ppQVar1;
                  ProKey::ProKey(&local_158,"QMAKE_EXTENSION_SHLIB");
                  QMakeEvaluator::first(&local_128,&pQVar18->super_QMakeEvaluator,&local_158);
                  QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>
                  ::QStringBuilder(&local_6f0,&local_730,&local_128);
                  QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>
                  ::QStringBuilder(&local_680.a,&local_6f0);
                  local_680.b = (char (*) [2])0x2252f2;
                  pQVar18 = *ppQVar1;
                  ProKey::ProKey(&local_1b8,"VER_MAJ");
                  QMakeEvaluator::first(&local_188,&pQVar18->super_QMakeEvaluator,&local_1b8);
                  QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>
                  ::QStringBuilder((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>
                                    *)&bundle_loc_1,&local_680,&local_188);
                  QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>
                  ::QStringBuilder((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>
                                    *)&soname,
                                   (QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>
                                    *)&bundle_loc_1);
                  pQVar18 = *ppQVar1;
                  ProKey::ProKey(&local_7c8,"VER_MIN");
                  QMakeEvaluator::first(&local_798,&pQVar18->super_QMakeEvaluator,&local_7c8);
                  QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>
                  ::QStringBuilder(&local_4a8,
                                   (QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>
                                    *)&soname,&local_798);
                  QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>
                  ::QStringBuilder((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>
                                    *)&bundle_loc,&local_4a8);
                  pQVar18 = *ppQVar1;
                  ProKey::ProKey(&local_828,"VER_PAT");
                  QMakeEvaluator::first(&local_7f8,&pQVar18->super_QMakeEvaluator,&local_828);
                  QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>
                  ::QStringBuilder((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>
                                    *)&MD_flag,
                                   (QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>
                                    *)&bundle_loc,&local_7f8);
                  ProString::
                  ProString<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<char_const(&)[4],ProString>,char_const(&)[2]>,ProString>,char_const(&)[2]>,ProString>,char_const(&)[2]>,ProString>,char_const(&)[2]>,ProString>
                            (&local_98,
                             (QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>
                              *)&MD_flag);
                  QList<ProString>::emplaceBack<ProString>(pQVar9,&local_98);
                  QArrayDataPointer<char16_t>::~QArrayDataPointer
                            ((QArrayDataPointer<char16_t> *)&local_98);
                  QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>
                  ::~QStringBuilder((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>
                                     *)&MD_flag);
                }
                QArrayDataPointer<char16_t>::~QArrayDataPointer
                          ((QArrayDataPointer<char16_t> *)&local_7f8);
                QArrayDataPointer<char16_t>::~QArrayDataPointer
                          ((QArrayDataPointer<char16_t> *)&local_828);
                QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>
                ::~QStringBuilder((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>
                                   *)&bundle_loc);
                QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>
                ::~QStringBuilder(&local_4a8);
                QArrayDataPointer<char16_t>::~QArrayDataPointer
                          ((QArrayDataPointer<char16_t> *)&local_798);
                QArrayDataPointer<char16_t>::~QArrayDataPointer
                          ((QArrayDataPointer<char16_t> *)&local_7c8);
                QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>
                ::~QStringBuilder((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>
                                   *)&soname);
                QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>
                ::~QStringBuilder((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>
                                   *)&bundle_loc_1);
                QArrayDataPointer<char16_t>::~QArrayDataPointer
                          ((QArrayDataPointer<char16_t> *)&local_188);
                QArrayDataPointer<char16_t>::~QArrayDataPointer
                          ((QArrayDataPointer<char16_t> *)&local_1b8);
                QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>
                ::~QStringBuilder(&local_680.a);
                QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>
                ::~QStringBuilder(&local_6f0);
                QArrayDataPointer<char16_t>::~QArrayDataPointer
                          ((QArrayDataPointer<char16_t> *)&local_128);
                QArrayDataPointer<char16_t>::~QArrayDataPointer
                          ((QArrayDataPointer<char16_t> *)&local_158);
                QArrayDataPointer<char16_t>::~QArrayDataPointer
                          ((QArrayDataPointer<char16_t> *)&local_730.a.b);
                QArrayDataPointer<char16_t>::~QArrayDataPointer
                          ((QArrayDataPointer<char16_t> *)&local_768.b);
                QArrayDataPointer<char16_t>::~QArrayDataPointer
                          ((QArrayDataPointer<char16_t> *)&local_c8);
                QArrayDataPointer<char16_t>::~QArrayDataPointer
                          ((QArrayDataPointer<char16_t> *)&local_f8);
                QArrayDataPointer<char16_t>::~QArrayDataPointer
                          ((QArrayDataPointer<char16_t> *)&local_68);
                pQVar18 = *ppQVar1;
              }
              pcVar19 = "TARGET_x.y.z";
            }
            else {
              ProKey::ProKey((ProKey *)&bundle_loc,"PRL_TARGET");
              pQVar9 = &QMakeEvaluator::valuesRef
                                  (&pQVar18->super_QMakeEvaluator,(ProKey *)&bundle_loc)->
                        super_QList<ProString>;
              pQVar18 = *ppQVar1;
              ProKey::ProKey((ProKey *)&bundle_loc_1,"TARGET");
              QMakeEvaluator::first(&soname,&pQVar18->super_QMakeEvaluator,(ProKey *)&bundle_loc_1);
              ppcVar2 = &MD_flag.m_string.d.ptr;
              MD_flag.m_string.d.d = (Data *)0x222550;
              ProString::ProString((ProString *)ppcVar2,&soname);
              ProString::ProString<char_const(&)[4],ProString>
                        ((ProString *)&local_4a8,
                         (QStringBuilder<const_char_(&)[4],_ProString> *)&MD_flag);
              QList<ProString>::emplaceFront<ProString>(pQVar9,(ProString *)&local_4a8);
              QArrayDataPointer<char16_t>::~QArrayDataPointer
                        ((QArrayDataPointer<char16_t> *)&local_4a8);
              QArrayDataPointer<char16_t>::~QArrayDataPointer
                        ((QArrayDataPointer<char16_t> *)ppcVar2);
              QArrayDataPointer<char16_t>::~QArrayDataPointer
                        ((QArrayDataPointer<char16_t> *)&soname);
              QArrayDataPointer<char16_t>::~QArrayDataPointer
                        ((QArrayDataPointer<char16_t> *)&bundle_loc_1);
              QArrayDataPointer<char16_t>::~QArrayDataPointer
                        ((QArrayDataPointer<char16_t> *)&bundle_loc);
              pQVar18 = *ppQVar1;
              ProKey::ProKey((ProKey *)&local_4a8,"TARGET_");
              pQVar9 = &QMakeEvaluator::valuesRef
                                  (&pQVar18->super_QMakeEvaluator,(ProKey *)&local_4a8)->
                        super_QList<ProString>;
              pQVar18 = *ppQVar1;
              ProKey::ProKey((ProKey *)&local_680,"TARGET");
              QMakeEvaluator::first
                        (&bundle_loc_1,&pQVar18->super_QMakeEvaluator,(ProKey *)&local_680);
              bundle_loc.m_string.d.d = (Data *)0x222550;
              ppcVar2 = &bundle_loc.m_string.d.ptr;
              ProString::ProString((ProString *)ppcVar2,&bundle_loc_1);
              QStringBuilder<const_char_(&)[4],_ProString>::QStringBuilder
                        ((QStringBuilder<const_char_(&)[4],_ProString> *)&MD_flag,
                         (QStringBuilder<const_char_(&)[4],_ProString> *)&bundle_loc);
              ProString::ProString<QStringBuilder<char_const(&)[4],ProString>,char_const(&)[4]>
                        (&soname,(QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[4]>
                                  *)&MD_flag);
              QList<ProString>::emplaceBack<ProString>(pQVar9,&soname);
              QArrayDataPointer<char16_t>::~QArrayDataPointer
                        ((QArrayDataPointer<char16_t> *)&soname);
              QArrayDataPointer<char16_t>::~QArrayDataPointer
                        ((QArrayDataPointer<char16_t> *)&MD_flag.m_string.d.ptr);
              QArrayDataPointer<char16_t>::~QArrayDataPointer
                        ((QArrayDataPointer<char16_t> *)ppcVar2);
              QArrayDataPointer<char16_t>::~QArrayDataPointer
                        ((QArrayDataPointer<char16_t> *)&bundle_loc_1);
              QArrayDataPointer<char16_t>::~QArrayDataPointer
                        ((QArrayDataPointer<char16_t> *)&local_680);
              QArrayDataPointer<char16_t>::~QArrayDataPointer
                        ((QArrayDataPointer<char16_t> *)&local_4a8);
              pQVar18 = *ppQVar1;
              QString::QString(&MD_flag.m_string,"lib_version_first");
              bVar7 = QMakeProject::isActiveConfig(pQVar18,&MD_flag.m_string,false);
              QArrayDataPointer<char16_t>::~QArrayDataPointer
                        ((QArrayDataPointer<char16_t> *)&MD_flag);
              pQVar18 = *ppQVar1;
              if (bVar7) {
                ProKey::ProKey((ProKey *)&soname,"TARGET_x");
                pQVar9 = &QMakeEvaluator::valuesRef
                                    (&pQVar18->super_QMakeEvaluator,(ProKey *)&soname)->
                          super_QList<ProString>;
                pQVar18 = *ppQVar1;
                ProKey::ProKey((ProKey *)&local_6f0,"VER_MAJ");
                QMakeEvaluator::first
                          ((ProString *)&local_680,&pQVar18->super_QMakeEvaluator,
                           (ProKey *)&local_6f0);
                local_4a8.a.a.a.a.a.a.a = (char (*) [4])0x222550;
                ProString::ProString
                          ((ProString *)((long)&local_4a8.a.a.a.a.a + 8),(ProString *)&local_680);
                QStringBuilder<const_char_(&)[4],_ProString>::QStringBuilder
                          ((QStringBuilder<const_char_(&)[4],_ProString> *)&bundle_loc,
                           (QStringBuilder<const_char_(&)[4],_ProString> *)&local_4a8);
                pQVar18 = *ppQVar1;
                pcVar19 = "TARGET";
              }
              else {
                ProKey::ProKey((ProKey *)&soname,"TARGET_x");
                pQVar9 = &QMakeEvaluator::valuesRef
                                    (&pQVar18->super_QMakeEvaluator,(ProKey *)&soname)->
                          super_QList<ProString>;
                pQVar18 = *ppQVar1;
                ProKey::ProKey((ProKey *)&local_6f0,"TARGET");
                QMakeEvaluator::first
                          ((ProString *)&local_680,&pQVar18->super_QMakeEvaluator,
                           (ProKey *)&local_6f0);
                local_4a8.a.a.a.a.a.a.a = (char (*) [4])0x222550;
                ProString::ProString
                          ((ProString *)((long)&local_4a8.a.a.a.a.a + 8),(ProString *)&local_680);
                QStringBuilder<const_char_(&)[4],_ProString>::QStringBuilder
                          ((QStringBuilder<const_char_(&)[4],_ProString> *)&bundle_loc,
                           (QStringBuilder<const_char_(&)[4],_ProString> *)&local_4a8);
                pQVar18 = *ppQVar1;
                pcVar19 = "VER_MAJ";
              }
              ProKey::ProKey((ProKey *)&local_768,pcVar19);
              QMakeEvaluator::first
                        ((ProString *)&local_730,&pQVar18->super_QMakeEvaluator,(ProKey *)&local_768
                        );
              QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>
              ::QStringBuilder((QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>
                                *)&MD_flag,
                               (QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>
                                *)&bundle_loc,(ProString *)&local_730);
              ProString::
              ProString<QStringBuilder<QStringBuilder<char_const(&)[4],ProString>,char_const(&)[2]>,ProString>
                        (&bundle_loc_1,
                         (QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>
                          *)&MD_flag);
              QList<ProString>::emplaceBack<ProString>(pQVar9,&bundle_loc_1);
              QArrayDataPointer<char16_t>::~QArrayDataPointer
                        ((QArrayDataPointer<char16_t> *)&bundle_loc_1);
              QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>
              ::~QStringBuilder((QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>
                                 *)&MD_flag);
              QArrayDataPointer<char16_t>::~QArrayDataPointer
                        ((QArrayDataPointer<char16_t> *)&local_730);
              QArrayDataPointer<char16_t>::~QArrayDataPointer
                        ((QArrayDataPointer<char16_t> *)&local_768);
              QArrayDataPointer<char16_t>::~QArrayDataPointer
                        ((QArrayDataPointer<char16_t> *)&bundle_loc.m_string.d.ptr);
              QArrayDataPointer<char16_t>::~QArrayDataPointer
                        ((QArrayDataPointer<char16_t> *)((long)&local_4a8.a.a.a.a.a + 8));
              QArrayDataPointer<char16_t>::~QArrayDataPointer
                        ((QArrayDataPointer<char16_t> *)&local_680);
              QArrayDataPointer<char16_t>::~QArrayDataPointer
                        ((QArrayDataPointer<char16_t> *)&local_6f0);
              QArrayDataPointer<char16_t>::~QArrayDataPointer
                        ((QArrayDataPointer<char16_t> *)&soname);
              pQVar18 = *ppQVar1;
              pcVar19 = "TARGET_x";
            }
LAB_0019601b:
            pPVar14 = &MD_flag;
            ProKey::ProKey((ProKey *)pPVar14,pcVar19);
            pQVar10 = (QArrayDataPointer<ProString> *)
                      QMakeEvaluator::valuesRef(&pQVar18->super_QMakeEvaluator,(ProKey *)pPVar14);
            pQVar18 = *ppQVar1;
            ProKey::ProKey((ProKey *)&bundle_loc,"TARGET");
            pQVar16 = (QArrayDataPointer<ProString> *)
                      QMakeEvaluator::valuesRef
                                (&pQVar18->super_QMakeEvaluator,(ProKey *)&bundle_loc);
            QArrayDataPointer<ProString>::operator=(pQVar16,pQVar10);
            QArrayDataPointer<char16_t>::~QArrayDataPointer
                      ((QArrayDataPointer<char16_t> *)&bundle_loc);
          }
          QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)pPVar14);
        }
        else {
          ProKey::ProKey((ProKey *)&bundle_loc_1,"PRL_TARGET");
          pQVar9 = &QMakeEvaluator::valuesRef
                              (&pQVar18->super_QMakeEvaluator,(ProKey *)&bundle_loc_1)->
                    super_QList<ProString>;
          pQVar18 = *ppQVar1;
          ProKey::ProKey((ProKey *)&local_730,"QMAKE_BUNDLE");
          QMakeEvaluator::first
                    ((ProString *)&local_6f0,&pQVar18->super_QMakeEvaluator,(ProKey *)&local_730);
          ProString::ProString(&soname,(ProString *)&local_6f0);
          pQVar18 = *ppQVar1;
          ProKey::ProKey((ProKey *)&local_68,"QMAKE_FRAMEWORK_VERSION");
          QMakeEvaluator::first
                    ((ProString *)&local_768,&pQVar18->super_QMakeEvaluator,(ProKey *)&local_68);
          QStringBuilder<QStringBuilder<ProString,_const_char_(&)[11]>,_ProString>::QStringBuilder
                    ((QStringBuilder<QStringBuilder<ProString,_const_char_(&)[11]>,_ProString> *)
                     &local_4a8,(QStringBuilder<ProString,_const_char_(&)[11]> *)&soname,
                     (ProString *)&local_768);
          QStringBuilder<QStringBuilder<ProString,_const_char_(&)[11]>,_ProString>::QStringBuilder
                    ((QStringBuilder<QStringBuilder<ProString,_const_char_(&)[11]>,_ProString> *)
                     &bundle_loc,
                     (QStringBuilder<QStringBuilder<ProString,_const_char_(&)[11]>,_ProString> *)
                     &local_4a8);
          pQVar18 = *ppQVar1;
          ProKey::ProKey((ProKey *)&local_c8,"TARGET");
          QMakeEvaluator::first(&local_98,&pQVar18->super_QMakeEvaluator,(ProKey *)&local_c8);
          QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<ProString,_const_char_(&)[11]>,_ProString>,_const_char_(&)[12]>,_ProString>
          ::QStringBuilder((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<ProString,_const_char_(&)[11]>,_ProString>,_const_char_(&)[12]>,_ProString>
                            *)&MD_flag,
                           (QStringBuilder<QStringBuilder<QStringBuilder<ProString,_const_char_(&)[11]>,_ProString>,_const_char_(&)[12]>
                            *)&bundle_loc,&local_98);
          ProString::
          ProString<QStringBuilder<QStringBuilder<QStringBuilder<ProString,char_const(&)[11]>,ProString>,char_const(&)[12]>,ProString>
                    ((ProString *)&local_680,
                     (QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<ProString,_const_char_(&)[11]>,_ProString>,_const_char_(&)[12]>,_ProString>
                      *)&MD_flag);
          QList<ProString>::emplaceFront<ProString>(pQVar9,(ProString *)&local_680);
          QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_680)
          ;
          QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<ProString,_const_char_(&)[11]>,_ProString>,_const_char_(&)[12]>,_ProString>
          ::~QStringBuilder((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<ProString,_const_char_(&)[11]>,_ProString>,_const_char_(&)[12]>,_ProString>
                             *)&MD_flag);
          QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_98);
          QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_c8);
          QStringBuilder<QStringBuilder<ProString,_const_char_(&)[11]>,_ProString>::~QStringBuilder
                    ((QStringBuilder<QStringBuilder<ProString,_const_char_(&)[11]>,_ProString> *)
                     &bundle_loc);
          QStringBuilder<QStringBuilder<ProString,_const_char_(&)[11]>,_ProString>::~QStringBuilder
                    ((QStringBuilder<QStringBuilder<ProString,_const_char_(&)[11]>,_ProString> *)
                     &local_4a8);
          QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_768)
          ;
          QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_68);
          QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&soname);
          QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_6f0)
          ;
          QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_730)
          ;
          QArrayDataPointer<char16_t>::~QArrayDataPointer
                    ((QArrayDataPointer<char16_t> *)&bundle_loc_1);
          bundle_loc_1.m_file = -0x55555556;
          bundle_loc_1._36_4_ = 0xaaaaaaaa;
          bundle_loc_1.m_hash = 0xaaaaaaaaaaaaaaaa;
          bundle_loc_1.m_string.d.size = -0x5555555555555556;
          bundle_loc_1.m_offset = -0x55555556;
          bundle_loc_1.m_length = -0x55555556;
          bundle_loc_1.m_string.d.d = (Data *)0xaaaaaaaaaaaaaaaa;
          bundle_loc_1.m_string.d.ptr = (char16_t *)0xaaaaaaaaaaaaaaaa;
          pQVar18 = *ppQVar1;
          ProKey::ProKey((ProKey *)&MD_flag,"QMAKE_BUNDLE_LOCATION");
          QMakeEvaluator::first(&bundle_loc_1,&pQVar18->super_QMakeEvaluator,(ProKey *)&MD_flag);
          QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&MD_flag);
          if ((bundle_loc_1.m_length != 0) &&
             (bVar7 = ProString::startsWith(&bundle_loc_1,"/",CaseSensitive), !bVar7)) {
            ProString::ProString(&MD_flag,"/");
            ProString::prepend(&bundle_loc_1,&MD_flag);
            QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&MD_flag)
            ;
          }
          bVar7 = ProString::endsWith(&bundle_loc_1,"/",CaseSensitive);
          if (!bVar7) {
            ProString::append(&bundle_loc_1,"/");
          }
          local_128.m_string.d.size = -0x5555555555555556;
          local_128.m_string.d.d = (Data *)0xaaaaaaaaaaaaaaaa;
          local_128.m_string.d.ptr = (char16_t *)0xaaaaaaaaaaaaaaaa;
          pQVar18 = *ppQVar1;
          ProKey::ProKey((ProKey *)&soname,"QMAKE_BUNDLE");
          QMakeEvaluator::first
                    ((ProString *)&local_4a8,&pQVar18->super_QMakeEvaluator,(ProKey *)&soname);
          ProString::ProString(&bundle_loc,(ProString *)&local_4a8);
          pQVar18 = *ppQVar1;
          ProKey::ProKey((ProKey *)&local_6f0,"TARGET");
          QMakeEvaluator::first
                    ((ProString *)&local_680,&pQVar18->super_QMakeEvaluator,(ProKey *)&local_6f0);
          QStringBuilder<QStringBuilder<ProString,_ProString_&>,_ProString>::QStringBuilder
                    ((QStringBuilder<QStringBuilder<ProString,_ProString_&>,_ProString> *)&MD_flag,
                     (QStringBuilder<ProString,_ProString_&> *)&bundle_loc,(ProString *)&local_680);
          QStringBuilder<QStringBuilder<ProString,_ProString_&>,_ProString>::convertTo<QString>
                    (&local_128.m_string,
                     (QStringBuilder<QStringBuilder<ProString,_ProString_&>,_ProString> *)&MD_flag);
          QStringBuilder<QStringBuilder<ProString,_ProString_&>,_ProString>::~QStringBuilder
                    ((QStringBuilder<QStringBuilder<ProString,_ProString_&>,_ProString> *)&MD_flag);
          QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_680)
          ;
          QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_6f0)
          ;
          QArrayDataPointer<char16_t>::~QArrayDataPointer
                    ((QArrayDataPointer<char16_t> *)&bundle_loc);
          QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_4a8)
          ;
          QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&soname);
          pQVar18 = *ppQVar1;
          ProKey::ProKey((ProKey *)&MD_flag,"TARGET_");
          pQVar9 = &QMakeEvaluator::valuesRef(&pQVar18->super_QMakeEvaluator,(ProKey *)&MD_flag)->
                    super_QList<ProString>;
          ProString::ProString(&bundle_loc,&local_128.m_string);
          QList<ProString>::emplaceBack<ProString>(pQVar9,&bundle_loc);
          QArrayDataPointer<char16_t>::~QArrayDataPointer
                    ((QArrayDataPointer<char16_t> *)&bundle_loc);
          QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&MD_flag);
          pQVar18 = *ppQVar1;
          QString::QString(&MD_flag.m_string,"shallow_bundle");
          bVar7 = QMakeProject::isActiveConfig(pQVar18,&MD_flag.m_string,false);
          QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&MD_flag);
          pQVar18 = *ppQVar1;
          if (bVar7) {
            pQVar20 = (QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>
                       *)&MD_flag;
            ProKey::ProKey((ProKey *)pQVar20,"TARGET_x.y");
            pQVar9 = &QMakeEvaluator::valuesRef(&pQVar18->super_QMakeEvaluator,(ProKey *)pQVar20)->
                      super_QList<ProString>;
            ProString::ProString(&bundle_loc,&local_128.m_string);
            QList<ProString>::emplaceBack<ProString>(pQVar9,&bundle_loc);
            QArrayDataPointer<char16_t>::~QArrayDataPointer
                      ((QArrayDataPointer<char16_t> *)&bundle_loc);
          }
          else {
            ProKey::ProKey((ProKey *)&local_680,"TARGET_x.y");
            pQVar9 = &QMakeEvaluator::valuesRef(&pQVar18->super_QMakeEvaluator,(ProKey *)&local_680)
                      ->super_QList<ProString>;
            pQVar18 = *ppQVar1;
            ProKey::ProKey((ProKey *)&local_768,"QMAKE_BUNDLE");
            QMakeEvaluator::first
                      ((ProString *)&local_730,&pQVar18->super_QMakeEvaluator,(ProKey *)&local_768);
            ProString::ProString(&soname,(ProString *)&local_730);
            pQVar18 = *ppQVar1;
            ProKey::ProKey((ProKey *)&local_98,"QMAKE_FRAMEWORK_VERSION");
            QMakeEvaluator::first(&local_68,&pQVar18->super_QMakeEvaluator,(ProKey *)&local_98);
            QStringBuilder<QStringBuilder<ProString,_const_char_(&)[11]>,_ProString>::QStringBuilder
                      ((QStringBuilder<QStringBuilder<ProString,_const_char_(&)[11]>,_ProString> *)
                       &local_4a8,(QStringBuilder<ProString,_const_char_(&)[11]> *)&soname,&local_68
                      );
            QStringBuilder<QStringBuilder<ProString,_const_char_(&)[11]>,_ProString>::QStringBuilder
                      ((QStringBuilder<QStringBuilder<ProString,_const_char_(&)[11]>,_ProString> *)
                       &bundle_loc,
                       (QStringBuilder<QStringBuilder<ProString,_const_char_(&)[11]>,_ProString> *)
                       &local_4a8);
            pQVar18 = *ppQVar1;
            ProKey::ProKey((ProKey *)&local_f8,"TARGET");
            QMakeEvaluator::first(&local_c8,&pQVar18->super_QMakeEvaluator,(ProKey *)&local_f8);
            QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<ProString,_const_char_(&)[11]>,_ProString>,_ProString_&>,_ProString>
            ::QStringBuilder((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<ProString,_const_char_(&)[11]>,_ProString>,_ProString_&>,_ProString>
                              *)&MD_flag,
                             (QStringBuilder<QStringBuilder<QStringBuilder<ProString,_const_char_(&)[11]>,_ProString>,_ProString_&>
                              *)&bundle_loc,&local_c8);
            ProString::
            ProString<QStringBuilder<QStringBuilder<QStringBuilder<ProString,char_const(&)[11]>,ProString>,ProString&>,ProString>
                      ((ProString *)&local_6f0,
                       (QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<ProString,_const_char_(&)[11]>,_ProString>,_ProString_&>,_ProString>
                        *)&MD_flag);
            QList<ProString>::emplaceBack<ProString>(pQVar9,(ProString *)&local_6f0);
            QArrayDataPointer<char16_t>::~QArrayDataPointer
                      ((QArrayDataPointer<char16_t> *)&local_6f0);
            QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<ProString,_const_char_(&)[11]>,_ProString>,_ProString_&>,_ProString>
            ::~QStringBuilder((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<ProString,_const_char_(&)[11]>,_ProString>,_ProString_&>,_ProString>
                               *)&MD_flag);
            QArrayDataPointer<char16_t>::~QArrayDataPointer
                      ((QArrayDataPointer<char16_t> *)&local_c8);
            QArrayDataPointer<char16_t>::~QArrayDataPointer
                      ((QArrayDataPointer<char16_t> *)&local_f8);
            QStringBuilder<QStringBuilder<ProString,_const_char_(&)[11]>,_ProString>::
            ~QStringBuilder((QStringBuilder<QStringBuilder<ProString,_const_char_(&)[11]>,_ProString>
                             *)&bundle_loc);
            QStringBuilder<QStringBuilder<ProString,_const_char_(&)[11]>,_ProString>::
            ~QStringBuilder((QStringBuilder<QStringBuilder<ProString,_const_char_(&)[11]>,_ProString>
                             *)&local_4a8);
            QArrayDataPointer<char16_t>::~QArrayDataPointer
                      ((QArrayDataPointer<char16_t> *)&local_68);
            QArrayDataPointer<char16_t>::~QArrayDataPointer
                      ((QArrayDataPointer<char16_t> *)&local_98);
            QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&soname);
            QArrayDataPointer<char16_t>::~QArrayDataPointer
                      ((QArrayDataPointer<char16_t> *)&local_730);
            QArrayDataPointer<char16_t>::~QArrayDataPointer
                      ((QArrayDataPointer<char16_t> *)&local_768);
            pQVar20 = &local_680;
          }
          QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)pQVar20);
          QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_128)
          ;
          QArrayDataPointer<char16_t>::~QArrayDataPointer
                    ((QArrayDataPointer<char16_t> *)&bundle_loc_1);
        }
        pQVar18 = *ppQVar1;
        ProKey::ProKey((ProKey *)&MD_flag,"QMAKE_LFLAGS_SONAME");
        pPVar12 = QMakeEvaluator::valuesRef(&pQVar18->super_QMakeEvaluator,(ProKey *)&MD_flag);
        lVar3 = (pPVar12->super_QList<ProString>).d.size;
        QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&MD_flag);
        if (lVar3 != 0) {
          soname.m_file = -0x55555556;
          soname._36_4_ = 0xaaaaaaaa;
          soname.m_hash = 0xaaaaaaaaaaaaaaaa;
          soname.m_string.d.size = -0x5555555555555556;
          soname.m_offset = -0x55555556;
          soname.m_length = -0x55555556;
          soname.m_string.d.d = (Data *)0xaaaaaaaaaaaaaaaa;
          soname.m_string.d.ptr = (char16_t *)0xaaaaaaaaaaaaaaaa;
          ProString::ProString(&soname);
          pQVar18 = *ppQVar1;
          QString::QString(&MD_flag.m_string,"plugin");
          bVar7 = QMakeProject::isActiveConfig(pQVar18,&MD_flag.m_string,false);
          QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&MD_flag);
          pQVar18 = *ppQVar1;
          if (bVar7) {
            ProKey::ProKey((ProKey *)&MD_flag,"TARGET");
            pPVar12 = QMakeEvaluator::valuesRef(&pQVar18->super_QMakeEvaluator,(ProKey *)&MD_flag);
            lVar3 = (pPVar12->super_QList<ProString>).d.size;
            QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&MD_flag)
            ;
            if (lVar3 != 0) {
              pQVar18 = *ppQVar1;
              pcVar19 = "TARGET";
              goto LAB_00196338;
            }
          }
          else {
            ProKey::ProKey((ProKey *)&MD_flag,"QMAKE_BUNDLE");
            bVar7 = QMakeProject::isEmpty(pQVar18,(ProKey *)&MD_flag);
            QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&MD_flag)
            ;
            if (bVar7) {
              pQVar18 = *ppQVar1;
              QString::QString(&MD_flag.m_string,"unversioned_soname");
              bVar7 = QMakeProject::isActiveConfig(pQVar18,&MD_flag.m_string,false);
              QArrayDataPointer<char16_t>::~QArrayDataPointer
                        ((QArrayDataPointer<char16_t> *)&MD_flag);
              if (!bVar7) {
                pQVar18 = *ppQVar1;
                ProKey::ProKey((ProKey *)&MD_flag,"TARGET_x");
                pPVar12 = QMakeEvaluator::valuesRef
                                    (&pQVar18->super_QMakeEvaluator,(ProKey *)&MD_flag);
                lVar3 = (pPVar12->super_QList<ProString>).d.size;
                QArrayDataPointer<char16_t>::~QArrayDataPointer
                          ((QArrayDataPointer<char16_t> *)&MD_flag);
                if (lVar3 == 0) goto LAB_0019637e;
                pQVar18 = *ppQVar1;
                pcVar19 = "TARGET_x";
                goto LAB_00196338;
              }
              pQVar18 = *ppQVar1;
              ProKey::ProKey((ProKey *)&local_680,"QMAKE_ORIG_TARGET");
              QMakeEvaluator::first
                        (&bundle_loc_1,&pQVar18->super_QMakeEvaluator,(ProKey *)&local_680);
              pPVar14 = (ProString *)((long)&local_4a8.a.a.a.a.a + 8);
              local_4a8.a.a.a.a.a.a.a = (char (*) [4])0x222550;
              ProString::ProString(pPVar14,&bundle_loc_1);
              QStringBuilder<const_char_(&)[4],_ProString>::QStringBuilder
                        ((QStringBuilder<const_char_(&)[4],_ProString> *)&bundle_loc,
                         (QStringBuilder<const_char_(&)[4],_ProString> *)&local_4a8);
              pQVar18 = *ppQVar1;
              ProKey::ProKey((ProKey *)&local_730,"QMAKE_EXTENSION_SHLIB");
              QMakeEvaluator::first
                        ((ProString *)&local_6f0,&pQVar18->super_QMakeEvaluator,(ProKey *)&local_730
                        );
              QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>
              ::QStringBuilder((QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>
                                *)&MD_flag,
                               (QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>
                                *)&bundle_loc,(ProString *)&local_6f0);
              ProString::operator=
                        (&soname,(QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>
                                  *)&MD_flag);
              QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>
              ::~QStringBuilder((QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>
                                 *)&MD_flag);
              QArrayDataPointer<char16_t>::~QArrayDataPointer
                        ((QArrayDataPointer<char16_t> *)&local_6f0);
              QArrayDataPointer<char16_t>::~QArrayDataPointer
                        ((QArrayDataPointer<char16_t> *)&local_730);
              QArrayDataPointer<char16_t>::~QArrayDataPointer
                        ((QArrayDataPointer<char16_t> *)&bundle_loc.m_string.d.ptr);
              QArrayDataPointer<char16_t>::~QArrayDataPointer
                        ((QArrayDataPointer<char16_t> *)pPVar14);
              QArrayDataPointer<char16_t>::~QArrayDataPointer
                        ((QArrayDataPointer<char16_t> *)&bundle_loc_1);
              pQVar20 = &local_680;
            }
            else {
              pQVar18 = *ppQVar1;
              pcVar19 = "TARGET_x.y";
LAB_00196338:
              pQVar20 = (QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>
                         *)&bundle_loc;
              ProKey::ProKey((ProKey *)pQVar20,pcVar19);
              QMakeEvaluator::first(&MD_flag,&pQVar18->super_QMakeEvaluator,(ProKey *)pQVar20);
              ProString::operator+=(&soname,&MD_flag);
              QArrayDataPointer<char16_t>::~QArrayDataPointer
                        ((QArrayDataPointer<char16_t> *)&MD_flag);
            }
            QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)pQVar20);
          }
LAB_0019637e:
          if (soname.m_length != 0) {
            pQVar18 = *ppQVar1;
            QString::QString((QString *)&local_4a8,"absolute_library_soname");
            bVar7 = QMakeProject::isActiveConfig(pQVar18,(QString *)&local_4a8,false);
            if (bVar7) {
              pQVar18 = *ppQVar1;
              ProKey::ProKey((ProKey *)&MD_flag,"INSTALLS");
              pQVar9 = &QMakeEvaluator::valuesRef(&pQVar18->super_QMakeEvaluator,(ProKey *)&MD_flag)
                        ->super_QList<ProString>;
              qVar17 = QtPrivate::indexOf<ProString,char[7]>(pQVar9,(char (*) [7])0x21a8fe,0);
              if (qVar17 == -1) {
                QArrayDataPointer<char16_t>::~QArrayDataPointer
                          ((QArrayDataPointer<char16_t> *)&MD_flag);
                goto LAB_00196558;
              }
              pQVar18 = *ppQVar1;
              ProKey::ProKey((ProKey *)&bundle_loc,"target.path");
              bVar7 = QMakeProject::isEmpty(pQVar18,(ProKey *)&bundle_loc);
              QArrayDataPointer<char16_t>::~QArrayDataPointer
                        ((QArrayDataPointer<char16_t> *)&bundle_loc);
              QArrayDataPointer<char16_t>::~QArrayDataPointer
                        ((QArrayDataPointer<char16_t> *)&MD_flag);
              QArrayDataPointer<char16_t>::~QArrayDataPointer
                        ((QArrayDataPointer<char16_t> *)&local_4a8);
              if (bVar7) goto LAB_00196565;
              local_4a8.a.a.a.a.a.a.b.m_string.d.ptr = (char16_t *)0xaaaaaaaaaaaaaaaa;
              local_4a8.a.a.a.a.a.a.a = (char (*) [4])0xaaaaaaaaaaaaaaaa;
              local_4a8.a.a.a.a.a.a.b.m_string.d.d = (Data *)0xaaaaaaaaaaaaaaaa;
              pQVar18 = *ppQVar1;
              ProKey::ProKey((ProKey *)&bundle_loc,"target.path");
              QMakeEvaluator::first(&MD_flag,&pQVar18->super_QMakeEvaluator,(ProKey *)&bundle_loc);
              ProString::toQString(&bundle_loc_1.m_string,&MD_flag);
              Option::fixPathToTargetOS((QString *)&local_4a8,&bundle_loc_1.m_string,true,true);
              QArrayDataPointer<char16_t>::~QArrayDataPointer
                        ((QArrayDataPointer<char16_t> *)&bundle_loc_1);
              QArrayDataPointer<char16_t>::~QArrayDataPointer
                        ((QArrayDataPointer<char16_t> *)&MD_flag);
              QArrayDataPointer<char16_t>::~QArrayDataPointer
                        ((QArrayDataPointer<char16_t> *)&bundle_loc);
              cVar8 = QString::endsWith((QString *)&local_4a8,0x26bbd0);
              if (cVar8 == '\0') {
                QString::append((QString *)&local_4a8);
              }
              ProString::ProString(&MD_flag,(QString *)&local_4a8);
              ProString::prepend(&soname,&MD_flag);
              QArrayDataPointer<char16_t>::~QArrayDataPointer
                        ((QArrayDataPointer<char16_t> *)&MD_flag);
              QArrayDataPointer<char16_t>::~QArrayDataPointer
                        ((QArrayDataPointer<char16_t> *)&local_4a8);
            }
            else {
LAB_00196558:
              QArrayDataPointer<char16_t>::~QArrayDataPointer
                        ((QArrayDataPointer<char16_t> *)&local_4a8);
LAB_00196565:
              pQVar18 = *ppQVar1;
              ProKey::ProKey((ProKey *)&MD_flag,"QMAKE_SONAME_PREFIX");
              bVar7 = QMakeProject::isEmpty(pQVar18,(ProKey *)&MD_flag);
              QArrayDataPointer<char16_t>::~QArrayDataPointer
                        ((QArrayDataPointer<char16_t> *)&MD_flag);
              if (!bVar7) {
                local_4a8.a.a.a.a.a.a.b.m_string.d.ptr = (char16_t *)0xaaaaaaaaaaaaaaaa;
                local_4a8.a.a.a.a.a.a.a = (char (*) [4])0xaaaaaaaaaaaaaaaa;
                local_4a8.a.a.a.a.a.a.b.m_string.d.d = (Data *)0xaaaaaaaaaaaaaaaa;
                pQVar18 = *ppQVar1;
                ProKey::ProKey((ProKey *)&bundle_loc,"QMAKE_SONAME_PREFIX");
                QMakeEvaluator::first(&MD_flag,&pQVar18->super_QMakeEvaluator,(ProKey *)&bundle_loc)
                ;
                ProString::toQString((QString *)&local_4a8,&MD_flag);
                QArrayDataPointer<char16_t>::~QArrayDataPointer
                          ((QArrayDataPointer<char16_t> *)&MD_flag);
                QArrayDataPointer<char16_t>::~QArrayDataPointer
                          ((QArrayDataPointer<char16_t> *)&bundle_loc);
                cVar8 = QString::startsWith((QChar)(char16_t)&local_4a8,0x40);
                if (cVar8 == '\0') {
                  Option::fixPathToTargetOS(&MD_flag.m_string,(QString *)&local_4a8,false,true);
                  pcVar6 = local_4a8.a.a.a.a.a.a.b.m_string.d.ptr;
                  pDVar5 = local_4a8.a.a.a.a.a.a.b.m_string.d.d;
                  pacVar4 = local_4a8.a.a.a.a.a.a.a;
                  local_4a8.a.a.a.a.a.a.a = (char (*) [4])MD_flag.m_string.d.d;
                  local_4a8.a.a.a.a.a.a.b.m_string.d.d = (Data *)MD_flag.m_string.d.ptr;
                  MD_flag.m_string.d.d = (Data *)pacVar4;
                  MD_flag.m_string.d.ptr = (char16_t *)pDVar5;
                  local_4a8.a.a.a.a.a.a.b.m_string.d.ptr = (char16_t *)MD_flag.m_string.d.size;
                  MD_flag.m_string.d.size = (qsizetype)pcVar6;
                  QArrayDataPointer<char16_t>::~QArrayDataPointer
                            ((QArrayDataPointer<char16_t> *)&MD_flag);
                }
                cVar8 = QString::endsWith((QString *)&local_4a8,0x26bbd0);
                if (cVar8 == '\0') {
                  QString::append((QString *)&local_4a8);
                }
                ProString::ProString(&MD_flag,(QString *)&local_4a8);
                ProString::prepend(&soname,&MD_flag);
                QArrayDataPointer<char16_t>::~QArrayDataPointer
                          ((QArrayDataPointer<char16_t> *)&MD_flag);
                QArrayDataPointer<char16_t>::~QArrayDataPointer
                          ((QArrayDataPointer<char16_t> *)&local_4a8);
              }
            }
            MakefileGenerator::escapeFilePath(&MD_flag,&this->super_MakefileGenerator,&soname);
            pQVar18 = (this->super_MakefileGenerator).project;
            ProKey::ProKey((ProKey *)&bundle_loc,"QMAKE_LFLAGS_SONAME");
            pQVar9 = &QMakeEvaluator::valuesRef
                                (&pQVar18->super_QMakeEvaluator,(ProKey *)&bundle_loc)->
                      super_QList<ProString>;
            iVar11 = QList<ProString>::begin(pQVar9);
            ProString::operator+=(iVar11.i,&MD_flag);
            QArrayDataPointer<char16_t>::~QArrayDataPointer
                      ((QArrayDataPointer<char16_t> *)&bundle_loc);
            QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&MD_flag)
            ;
          }
          QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&soname);
        }
        pQVar18 = *ppQVar1;
        ProKey::ProKey((ProKey *)&MD_flag,"QMAKE_LINK_SHLIB_CMD");
        pPVar12 = QMakeEvaluator::valuesRef(&pQVar18->super_QMakeEvaluator,(ProKey *)&MD_flag);
        lVar3 = (pPVar12->super_QList<ProString>).d.size;
        QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&MD_flag);
        if (lVar3 == 0) {
          pQVar18 = *ppQVar1;
          ProKey::ProKey((ProKey *)&local_4a8,"QMAKE_LINK_SHLIB_CMD");
          pQVar9 = &QMakeEvaluator::valuesRef(&pQVar18->super_QMakeEvaluator,(ProKey *)&local_4a8)->
                    super_QList<ProString>;
          pQVar18 = *ppQVar1;
          ProKey::ProKey((ProKey *)&local_680,"QMAKE_LINK_O_FLAG");
          QMakeEvaluator::first(&bundle_loc_1,&pQVar18->super_QMakeEvaluator,(ProKey *)&local_680);
          ppcVar2 = &bundle_loc.m_string.d.ptr;
          bundle_loc.m_string.d.d = (Data *)0x21c582;
          ProString::ProString((ProString *)ppcVar2,&bundle_loc_1);
          QStringBuilder<const_char_(&)[19],_ProString>::QStringBuilder
                    ((QStringBuilder<const_char_(&)[19],_ProString> *)&MD_flag,
                     (QStringBuilder<const_char_(&)[19],_ProString> *)&bundle_loc);
          ProString::ProString<QStringBuilder<char_const(&)[19],ProString>,char_const(&)[40]>
                    (&soname,(QStringBuilder<QStringBuilder<const_char_(&)[19],_ProString>,_const_char_(&)[40]>
                              *)&MD_flag);
          QList<ProString>::emplaceBack<ProString>(pQVar9,&soname);
          QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&soname);
          QArrayDataPointer<char16_t>::~QArrayDataPointer
                    ((QArrayDataPointer<char16_t> *)&MD_flag.m_string.d.ptr);
          QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)ppcVar2);
          QArrayDataPointer<char16_t>::~QArrayDataPointer
                    ((QArrayDataPointer<char16_t> *)&bundle_loc_1);
          QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_680)
          ;
          this_01 = &local_4a8;
          goto LAB_00191ade;
        }
      }
    }
    else {
      ProKey::ProKey((ProKey *)&MD_flag,"QMAKE_BUNDLE");
      bVar7 = QMakeProject::isEmpty(pQVar18,(ProKey *)&MD_flag);
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&MD_flag);
      if (!bVar7) {
        bundle_loc.m_file = -0x55555556;
        bundle_loc._36_4_ = 0xaaaaaaaa;
        bundle_loc.m_hash = 0xaaaaaaaaaaaaaaaa;
        bundle_loc.m_string.d.size = -0x5555555555555556;
        bundle_loc.m_offset = -0x55555556;
        bundle_loc.m_length = -0x55555556;
        bundle_loc.m_string.d.d = (Data *)0xaaaaaaaaaaaaaaaa;
        bundle_loc.m_string.d.ptr = (char16_t *)0xaaaaaaaaaaaaaaaa;
        pQVar18 = *ppQVar1;
        ProKey::ProKey((ProKey *)&MD_flag,"QMAKE_BUNDLE_LOCATION");
        QMakeEvaluator::first(&bundle_loc,&pQVar18->super_QMakeEvaluator,(ProKey *)&MD_flag);
        QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&MD_flag);
        if ((bundle_loc.m_length != 0) &&
           (bVar7 = ProString::startsWith(&bundle_loc,"/",CaseSensitive), !bVar7)) {
          ProString::ProString(&MD_flag,"/");
          ProString::prepend(&bundle_loc,&MD_flag);
          QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&MD_flag);
        }
        bVar7 = ProString::endsWith(&bundle_loc,"/",CaseSensitive);
        if (!bVar7) {
          ProString::append(&bundle_loc,"/");
        }
        pQVar18 = *ppQVar1;
        ProKey::ProKey((ProKey *)&local_4a8,"TARGET");
        pQVar9 = &QMakeEvaluator::valuesRef(&pQVar18->super_QMakeEvaluator,(ProKey *)&local_4a8)->
                  super_QList<ProString>;
        iVar11 = QList<ProString>::begin(pQVar9);
        pQVar18 = *ppQVar1;
        ProKey::ProKey((ProKey *)&local_680,"QMAKE_BUNDLE");
        QMakeEvaluator::first(&bundle_loc_1,&pQVar18->super_QMakeEvaluator,(ProKey *)&local_680);
        ProString::ProString(&MD_flag,&bundle_loc_1);
        ProString::ProString<ProString,ProString&>
                  (&soname,(QStringBuilder<ProString,_ProString_&> *)&MD_flag);
        ProString::prepend(iVar11.i,&soname);
        QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&soname);
        QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&MD_flag);
        QArrayDataPointer<char16_t>::~QArrayDataPointer
                  ((QArrayDataPointer<char16_t> *)&bundle_loc_1);
        QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_680);
        QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_4a8);
        QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&bundle_loc);
      }
      pQVar18 = *ppQVar1;
      ProKey::ProKey((ProKey *)&MD_flag,"TARGET");
      bVar7 = QMakeProject::isEmpty(pQVar18,(ProKey *)&MD_flag);
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&MD_flag);
      if (!bVar7) {
        pQVar18 = *ppQVar1;
        this_01 = (QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>
                   *)&MD_flag;
        ProKey::ProKey((ProKey *)this_01,"TARGET");
        pQVar9 = &QMakeEvaluator::valuesRef(&pQVar18->super_QMakeEvaluator,(ProKey *)this_01)->
                  super_QList<ProString>;
        iVar11 = QList<ProString>::begin(pQVar9);
        pQVar18 = *ppQVar1;
        ProKey::ProKey((ProKey *)&local_4a8,"DESTDIR");
        QMakeEvaluator::first(&bundle_loc,&pQVar18->super_QMakeEvaluator,(ProKey *)&local_4a8);
        ProString::prepend(iVar11.i,&bundle_loc);
        QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&bundle_loc);
        QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_4a8);
        goto LAB_00191ade;
      }
    }
  }
  pQVar18 = *ppQVar1;
  ProKey::ProKey((ProKey *)&MD_flag,"QMAKE_APP_FLAG");
  pPVar12 = QMakeEvaluator::valuesRef(&pQVar18->super_QMakeEvaluator,(ProKey *)&MD_flag);
  if ((pPVar12->super_QList<ProString>).d.size == 0) {
    pQVar18 = *ppQVar1;
    ProKey::ProKey((ProKey *)&local_4a8,"TEMPLATE");
    QMakeEvaluator::first(&bundle_loc,&pQVar18->super_QMakeEvaluator,(ProKey *)&local_4a8);
    bVar7 = ProString::operator==(&bundle_loc,"aux");
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&bundle_loc);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_4a8);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&MD_flag);
    if (bVar7) goto LAB_00191b86;
    pQVar18 = *ppQVar1;
    QString::QString(&MD_flag.m_string,"dll");
    bVar7 = QMakeProject::isActiveConfig(pQVar18,&MD_flag.m_string,false);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&MD_flag);
    if (!bVar7) goto LAB_00191cc4;
    pQVar18 = *ppQVar1;
    QString::QString(&MD_flag.m_string,"plugin");
    bVar7 = QMakeProject::isActiveConfig(pQVar18,&MD_flag.m_string,false);
    if (bVar7) {
      pQVar18 = *ppQVar1;
      QString::QString(&bundle_loc.m_string,"plugin_no_share_shlib_cflags");
      bVar7 = QMakeProject::isActiveConfig(pQVar18,&bundle_loc.m_string,false);
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&bundle_loc);
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&MD_flag);
      if (!bVar7) goto LAB_001923cc;
    }
    else {
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&MD_flag);
LAB_001923cc:
      pQVar18 = *ppQVar1;
      ProKey::ProKey((ProKey *)&MD_flag,"QMAKE_CFLAGS_SHLIB");
      pQVar9 = &QMakeEvaluator::valuesRef(&pQVar18->super_QMakeEvaluator,(ProKey *)&MD_flag)->
                super_QList<ProString>;
      pQVar18 = *ppQVar1;
      ProKey::ProKey((ProKey *)&bundle_loc,"QMAKE_CFLAGS");
      pQVar13 = &QMakeEvaluator::valuesRef(&pQVar18->super_QMakeEvaluator,(ProKey *)&bundle_loc)->
                 super_QList<ProString>;
      QList<ProString>::append(pQVar13,pQVar9);
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&bundle_loc);
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&MD_flag);
      pQVar18 = *ppQVar1;
      ProKey::ProKey((ProKey *)&MD_flag,"QMAKE_CXXFLAGS_SHLIB");
      pQVar9 = &QMakeEvaluator::valuesRef(&pQVar18->super_QMakeEvaluator,(ProKey *)&MD_flag)->
                super_QList<ProString>;
      pQVar18 = *ppQVar1;
      ProKey::ProKey((ProKey *)&bundle_loc,"QMAKE_CXXFLAGS");
      pQVar13 = &QMakeEvaluator::valuesRef(&pQVar18->super_QMakeEvaluator,(ProKey *)&bundle_loc)->
                 super_QList<ProString>;
      QList<ProString>::append(pQVar13,pQVar9);
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&bundle_loc);
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&MD_flag);
    }
    pQVar18 = *ppQVar1;
    QString::QString(&MD_flag.m_string,"plugin");
    bVar7 = QMakeProject::isActiveConfig(pQVar18,&MD_flag.m_string,false);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&MD_flag);
    pQVar18 = *ppQVar1;
    if (bVar7) {
      ProKey::ProKey((ProKey *)&MD_flag,"QMAKE_CFLAGS_PLUGIN");
      pQVar9 = &QMakeEvaluator::valuesRef(&pQVar18->super_QMakeEvaluator,(ProKey *)&MD_flag)->
                super_QList<ProString>;
      pQVar18 = *ppQVar1;
      ProKey::ProKey((ProKey *)&bundle_loc,"QMAKE_CFLAGS");
      pQVar13 = &QMakeEvaluator::valuesRef(&pQVar18->super_QMakeEvaluator,(ProKey *)&bundle_loc)->
                 super_QList<ProString>;
      QList<ProString>::append(pQVar13,pQVar9);
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&bundle_loc);
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&MD_flag);
      pQVar18 = *ppQVar1;
      ProKey::ProKey((ProKey *)&MD_flag,"QMAKE_CXXFLAGS_PLUGIN");
      pQVar9 = &QMakeEvaluator::valuesRef(&pQVar18->super_QMakeEvaluator,(ProKey *)&MD_flag)->
                super_QList<ProString>;
      pQVar18 = *ppQVar1;
      ProKey::ProKey((ProKey *)&bundle_loc,"QMAKE_CXXFLAGS");
      pQVar13 = &QMakeEvaluator::valuesRef(&pQVar18->super_QMakeEvaluator,(ProKey *)&bundle_loc)->
                 super_QList<ProString>;
      QList<ProString>::append(pQVar13,pQVar9);
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&bundle_loc);
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&MD_flag);
      pQVar18 = *ppQVar1;
      ProKey::ProKey((ProKey *)&MD_flag,"QMAKE_LFLAGS_PLUGIN");
      pQVar9 = &QMakeEvaluator::valuesRef(&pQVar18->super_QMakeEvaluator,(ProKey *)&MD_flag)->
                super_QList<ProString>;
      pQVar18 = *ppQVar1;
      ProKey::ProKey((ProKey *)&bundle_loc,"QMAKE_LFLAGS");
      pQVar13 = &QMakeEvaluator::valuesRef(&pQVar18->super_QMakeEvaluator,(ProKey *)&bundle_loc)->
                 super_QList<ProString>;
      QList<ProString>::append(pQVar13,pQVar9);
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&bundle_loc);
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&MD_flag);
      pQVar18 = *ppQVar1;
      QString::QString(&MD_flag.m_string,"plugin_with_soname");
      bVar7 = QMakeProject::isActiveConfig(pQVar18,&MD_flag.m_string,false);
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&MD_flag);
      if (!bVar7) goto LAB_00191cc4;
    }
    else {
      ProKey::ProKey((ProKey *)&MD_flag,"QMAKE_LFLAGS_SHLIB");
      pQVar9 = &QMakeEvaluator::valuesRef(&pQVar18->super_QMakeEvaluator,(ProKey *)&MD_flag)->
                super_QList<ProString>;
      pQVar18 = *ppQVar1;
      ProKey::ProKey((ProKey *)&bundle_loc,"QMAKE_LFLAGS");
      pQVar13 = &QMakeEvaluator::valuesRef(&pQVar18->super_QMakeEvaluator,(ProKey *)&bundle_loc)->
                 super_QList<ProString>;
      QList<ProString>::append(pQVar13,pQVar9);
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&bundle_loc);
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&MD_flag);
      pQVar18 = *ppQVar1;
      ProKey::ProKey((ProKey *)&MD_flag,"QMAKE_LFLAGS_COMPAT_VERSION");
      bVar7 = QMakeProject::isEmpty(pQVar18,(ProKey *)&MD_flag);
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&MD_flag);
      if (!bVar7) {
        pQVar18 = *ppQVar1;
        ProKey::ProKey((ProKey *)&MD_flag,"COMPAT_VERSION");
        bVar7 = QMakeProject::isEmpty(pQVar18,(ProKey *)&MD_flag);
        QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&MD_flag);
        if (bVar7) {
          pQVar18 = *ppQVar1;
          ProKey::ProKey((ProKey *)&local_680,"QMAKE_LFLAGS_COMPAT_VERSION");
          QMakeEvaluator::first(&bundle_loc_1,&pQVar18->super_QMakeEvaluator,(ProKey *)&local_680);
          pQVar18 = *ppQVar1;
          ProKey::ProKey((ProKey *)&local_730,"VER_MAJ");
          QMakeEvaluator::first
                    ((ProString *)&local_6f0,&pQVar18->super_QMakeEvaluator,(ProKey *)&local_730);
          QStringBuilder<ProString,_ProString>::QStringBuilder
                    ((QStringBuilder<ProString,_ProString> *)&local_4a8,&bundle_loc_1,
                     (ProString *)&local_6f0);
          QStringBuilder<ProString,_ProString>::QStringBuilder
                    ((QStringBuilder<ProString,_ProString> *)&bundle_loc,
                     (QStringBuilder<ProString,_ProString> *)&local_4a8);
          pQVar18 = *ppQVar1;
          ProKey::ProKey((ProKey *)&local_68,"VER_MIN");
          QMakeEvaluator::first
                    ((ProString *)&local_768,&pQVar18->super_QMakeEvaluator,(ProKey *)&local_68);
          QStringBuilder<QStringBuilder<QStringBuilder<ProString,_ProString>,_const_char_(&)[2]>,_ProString>
          ::QStringBuilder((QStringBuilder<QStringBuilder<QStringBuilder<ProString,_ProString>,_const_char_(&)[2]>,_ProString>
                            *)&MD_flag,
                           (QStringBuilder<QStringBuilder<ProString,_ProString>,_const_char_(&)[2]>
                            *)&bundle_loc,(ProString *)&local_768);
          QStringBuilder<QStringBuilder<QStringBuilder<ProString,_ProString>,_const_char_(&)[2]>,_ProString>
          ::convertTo<QString>
                    (&local_c8.m_string,
                     (QStringBuilder<QStringBuilder<QStringBuilder<ProString,_ProString>,_const_char_(&)[2]>,_ProString>
                      *)&MD_flag);
          ProString::ProString(&soname,&local_c8.m_string);
          pQVar18 = *ppQVar1;
          ProKey::ProKey((ProKey *)&local_98,"QMAKE_LFLAGS");
          pQVar9 = &QMakeEvaluator::valuesRef(&pQVar18->super_QMakeEvaluator,(ProKey *)&local_98)->
                    super_QList<ProString>;
          QList<ProString>::emplaceBack<ProString>(pQVar9,&soname);
          QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_98);
          QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&soname);
          QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_c8);
          QStringBuilder<QStringBuilder<QStringBuilder<ProString,_ProString>,_const_char_(&)[2]>,_ProString>
          ::~QStringBuilder((QStringBuilder<QStringBuilder<QStringBuilder<ProString,_ProString>,_const_char_(&)[2]>,_ProString>
                             *)&MD_flag);
          QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_768)
          ;
          QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_68);
          QStringBuilder<ProString,_ProString>::~QStringBuilder
                    ((QStringBuilder<ProString,_ProString> *)&bundle_loc);
          QStringBuilder<ProString,_ProString>::~QStringBuilder
                    ((QStringBuilder<ProString,_ProString> *)&local_4a8);
          QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_6f0)
          ;
          QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_730)
          ;
          QArrayDataPointer<char16_t>::~QArrayDataPointer
                    ((QArrayDataPointer<char16_t> *)&bundle_loc_1);
          pQVar20 = &local_680;
        }
        else {
          pQVar18 = *ppQVar1;
          ProKey::ProKey((ProKey *)&soname,"QMAKE_LFLAGS_COMPAT_VERSION");
          QMakeEvaluator::first
                    ((ProString *)&local_4a8,&pQVar18->super_QMakeEvaluator,(ProKey *)&soname);
          pQVar18 = *ppQVar1;
          ProKey::ProKey((ProKey *)&local_680,"COMPATIBILITY_VERSION");
          QMakeEvaluator::first(&bundle_loc_1,&pQVar18->super_QMakeEvaluator,(ProKey *)&local_680);
          QStringBuilder<ProString,_ProString>::QStringBuilder
                    ((QStringBuilder<ProString,_ProString> *)&MD_flag,(ProString *)&local_4a8,
                     &bundle_loc_1);
          QStringBuilder<ProString,_ProString>::convertTo<QString>
                    ((QString *)&local_730,(QStringBuilder<ProString,_ProString> *)&MD_flag);
          ProString::ProString(&bundle_loc,(QString *)&local_730);
          pQVar18 = *ppQVar1;
          ProKey::ProKey((ProKey *)&local_6f0,"QMAKE_LFLAGS");
          pQVar9 = &QMakeEvaluator::valuesRef(&pQVar18->super_QMakeEvaluator,(ProKey *)&local_6f0)->
                    super_QList<ProString>;
          QList<ProString>::emplaceBack<ProString>(pQVar9,&bundle_loc);
          QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_6f0)
          ;
          QArrayDataPointer<char16_t>::~QArrayDataPointer
                    ((QArrayDataPointer<char16_t> *)&bundle_loc);
          QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_730)
          ;
          QStringBuilder<ProString,_ProString>::~QStringBuilder
                    ((QStringBuilder<ProString,_ProString> *)&MD_flag);
          QArrayDataPointer<char16_t>::~QArrayDataPointer
                    ((QArrayDataPointer<char16_t> *)&bundle_loc_1);
          QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_680)
          ;
          QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_4a8)
          ;
          pQVar20 = (QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>
                     *)&soname;
        }
        QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)pQVar20);
      }
      pQVar18 = *ppQVar1;
      ProKey::ProKey((ProKey *)&MD_flag,"QMAKE_LFLAGS_VERSION");
      bVar7 = QMakeProject::isEmpty(pQVar18,(ProKey *)&MD_flag);
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&MD_flag);
      if (!bVar7) {
        pQVar18 = *ppQVar1;
        ProKey::ProKey((ProKey *)&local_730,"QMAKE_LFLAGS_VERSION");
        QMakeEvaluator::first
                  ((ProString *)&local_6f0,&pQVar18->super_QMakeEvaluator,(ProKey *)&local_730);
        pQVar18 = *ppQVar1;
        ProKey::ProKey((ProKey *)&local_68,"VER_MAJ");
        QMakeEvaluator::first
                  ((ProString *)&local_768,&pQVar18->super_QMakeEvaluator,(ProKey *)&local_68);
        QStringBuilder<ProString,_ProString>::QStringBuilder
                  ((QStringBuilder<ProString,_ProString> *)&bundle_loc_1,(ProString *)&local_6f0,
                   (ProString *)&local_768);
        QStringBuilder<ProString,_ProString>::QStringBuilder
                  ((QStringBuilder<ProString,_ProString> *)&soname,
                   (QStringBuilder<ProString,_ProString> *)&bundle_loc_1);
        pQVar18 = *ppQVar1;
        ProKey::ProKey((ProKey *)&local_c8,"VER_MIN");
        QMakeEvaluator::first(&local_98,&pQVar18->super_QMakeEvaluator,(ProKey *)&local_c8);
        QStringBuilder<QStringBuilder<QStringBuilder<ProString,_ProString>,_const_char_(&)[2]>,_ProString>
        ::QStringBuilder((QStringBuilder<QStringBuilder<QStringBuilder<ProString,_ProString>,_const_char_(&)[2]>,_ProString>
                          *)&local_4a8,
                         (QStringBuilder<QStringBuilder<ProString,_ProString>,_const_char_(&)[2]> *)
                         &soname,&local_98);
        QStringBuilder<QStringBuilder<QStringBuilder<ProString,_ProString>,_const_char_(&)[2]>,_ProString>
        ::QStringBuilder((QStringBuilder<QStringBuilder<QStringBuilder<ProString,_ProString>,_const_char_(&)[2]>,_ProString>
                          *)&bundle_loc,
                         (QStringBuilder<QStringBuilder<QStringBuilder<ProString,_ProString>,_const_char_(&)[2]>,_ProString>
                          *)&local_4a8);
        pQVar18 = *ppQVar1;
        ProKey::ProKey((ProKey *)&local_128,"VER_PAT");
        QMakeEvaluator::first(&local_f8,&pQVar18->super_QMakeEvaluator,(ProKey *)&local_128);
        QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<ProString,_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>
        ::QStringBuilder((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<ProString,_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>
                          *)&MD_flag,
                         (QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<ProString,_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>
                          *)&bundle_loc,&local_f8);
        QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<ProString,_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>
        ::convertTo<QString>
                  (&local_188.m_string,
                   (QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<ProString,_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>
                    *)&MD_flag);
        ProString::ProString((ProString *)&local_680,&local_188.m_string);
        pQVar18 = *ppQVar1;
        ProKey::ProKey(&local_158,"QMAKE_LFLAGS");
        pQVar9 = &QMakeEvaluator::valuesRef(&pQVar18->super_QMakeEvaluator,&local_158)->
                  super_QList<ProString>;
        QList<ProString>::emplaceBack<ProString>(pQVar9,(ProString *)&local_680);
        QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_158);
        QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_680);
        QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_188);
        QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<ProString,_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>
        ::~QStringBuilder((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<ProString,_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>
                           *)&MD_flag);
        QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_f8);
        QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_128);
        QStringBuilder<QStringBuilder<QStringBuilder<ProString,_ProString>,_const_char_(&)[2]>,_ProString>
        ::~QStringBuilder((QStringBuilder<QStringBuilder<QStringBuilder<ProString,_ProString>,_const_char_(&)[2]>,_ProString>
                           *)&bundle_loc);
        QStringBuilder<QStringBuilder<QStringBuilder<ProString,_ProString>,_const_char_(&)[2]>,_ProString>
        ::~QStringBuilder((QStringBuilder<QStringBuilder<QStringBuilder<ProString,_ProString>,_const_char_(&)[2]>,_ProString>
                           *)&local_4a8);
        QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_98);
        QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_c8);
        QStringBuilder<ProString,_ProString>::~QStringBuilder
                  ((QStringBuilder<ProString,_ProString> *)&soname);
        QStringBuilder<ProString,_ProString>::~QStringBuilder
                  ((QStringBuilder<ProString,_ProString> *)&bundle_loc_1);
        QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_768);
        QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_68);
        QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_6f0);
        QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_730);
      }
    }
    pQVar18 = *ppQVar1;
    pcVar19 = "QMAKE_LFLAGS_SONAME";
  }
  else {
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&MD_flag);
LAB_00191b86:
    pQVar18 = *ppQVar1;
    ProKey::ProKey((ProKey *)&MD_flag,"QMAKE_CFLAGS_APP");
    pQVar9 = &QMakeEvaluator::valuesRef(&pQVar18->super_QMakeEvaluator,(ProKey *)&MD_flag)->
              super_QList<ProString>;
    pQVar18 = *ppQVar1;
    ProKey::ProKey((ProKey *)&bundle_loc,"QMAKE_CFLAGS");
    pQVar13 = &QMakeEvaluator::valuesRef(&pQVar18->super_QMakeEvaluator,(ProKey *)&bundle_loc)->
               super_QList<ProString>;
    QList<ProString>::append(pQVar13,pQVar9);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&bundle_loc);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&MD_flag);
    pQVar18 = *ppQVar1;
    ProKey::ProKey((ProKey *)&MD_flag,"QMAKE_CXXFLAGS_APP");
    pQVar9 = &QMakeEvaluator::valuesRef(&pQVar18->super_QMakeEvaluator,(ProKey *)&MD_flag)->
              super_QList<ProString>;
    pQVar18 = *ppQVar1;
    ProKey::ProKey((ProKey *)&bundle_loc,"QMAKE_CXXFLAGS");
    pQVar13 = &QMakeEvaluator::valuesRef(&pQVar18->super_QMakeEvaluator,(ProKey *)&bundle_loc)->
               super_QList<ProString>;
    QList<ProString>::append(pQVar13,pQVar9);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&bundle_loc);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&MD_flag);
    pQVar18 = *ppQVar1;
    pcVar19 = "QMAKE_LFLAGS_APP";
  }
  ProKey::ProKey((ProKey *)&MD_flag,pcVar19);
  pQVar9 = &QMakeEvaluator::valuesRef(&pQVar18->super_QMakeEvaluator,(ProKey *)&MD_flag)->
            super_QList<ProString>;
  pQVar18 = *ppQVar1;
  ProKey::ProKey((ProKey *)&bundle_loc,"QMAKE_LFLAGS");
  pQVar13 = &QMakeEvaluator::valuesRef(&pQVar18->super_QMakeEvaluator,(ProKey *)&bundle_loc)->
             super_QList<ProString>;
  QList<ProString>::append(pQVar13,pQVar9);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&bundle_loc);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&MD_flag);
LAB_00191cc4:
  if (this->include_deps == true) {
    pQVar18 = *ppQVar1;
    QString::QString(&MD_flag.m_string,"gcc_MD_depends");
    bVar7 = QMakeProject::isActiveConfig(pQVar18,&MD_flag.m_string,false);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&MD_flag);
    if (bVar7) {
      MD_flag.m_file = -0x55555556;
      MD_flag._36_4_ = 0xaaaaaaaa;
      MD_flag.m_hash = 0xaaaaaaaaaaaaaaaa;
      MD_flag.m_string.d.size = -0x5555555555555556;
      MD_flag.m_offset = -0x55555556;
      MD_flag.m_length = -0x55555556;
      MD_flag.m_string.d.d = (Data *)0xaaaaaaaaaaaaaaaa;
      MD_flag.m_string.d.ptr = (char16_t *)0xaaaaaaaaaaaaaaaa;
      ProString::ProString(&MD_flag,"-MD");
      pQVar18 = *ppQVar1;
      ProKey::ProKey((ProKey *)&bundle_loc,"QMAKE_CFLAGS");
      pQVar9 = &QMakeEvaluator::valuesRef(&pQVar18->super_QMakeEvaluator,(ProKey *)&bundle_loc)->
                super_QList<ProString>;
      QList<ProString>::emplaceBack<ProString_const&>(pQVar9,&MD_flag);
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&bundle_loc);
      pQVar18 = *ppQVar1;
      ProKey::ProKey((ProKey *)&bundle_loc,"QMAKE_CXXFLAGS");
      pQVar9 = &QMakeEvaluator::valuesRef(&pQVar18->super_QMakeEvaluator,(ProKey *)&bundle_loc)->
                super_QList<ProString>;
      QList<ProString>::emplaceBack<ProString_const&>(pQVar9,&MD_flag);
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&bundle_loc);
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&MD_flag);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void UnixMakefileGenerator::init2()
{
    if(project->isEmpty("QMAKE_FRAMEWORK_VERSION"))
        project->values("QMAKE_FRAMEWORK_VERSION").append(project->first("VER_MAJ"));

    if (project->first("TEMPLATE") == "aux") {
        project->values("PRL_TARGET") = {
            project->first("QMAKE_PREFIX_STATICLIB") +
            project->first("TARGET")
        };
    } else if (!project->values("QMAKE_APP_FLAG").isEmpty()) {
        if(!project->isEmpty("QMAKE_BUNDLE")) {
            ProString bundle_loc = project->first("QMAKE_BUNDLE_LOCATION");
            if(!bundle_loc.isEmpty() && !bundle_loc.startsWith("/"))
                bundle_loc.prepend("/");
            if(!bundle_loc.endsWith("/"))
                bundle_loc += "/";
            project->values("TARGET").first().prepend(project->first("QMAKE_BUNDLE") + bundle_loc);
        }
        if(!project->isEmpty("TARGET"))
            project->values("TARGET").first().prepend(project->first("DESTDIR"));
    } else if (project->isActiveConfig("staticlib")) {
        project->values("PRL_TARGET") =
            project->values("TARGET").first().prepend(project->first("QMAKE_PREFIX_STATICLIB"));
        project->values("TARGET").first() += "." + project->first("QMAKE_EXTENSION_STATICLIB");
        if(project->values("QMAKE_AR_CMD").isEmpty())
            project->values("QMAKE_AR_CMD").append("$(AR) $(DESTDIR)$(TARGET) $(OBJECTS)");
    } else {
        project->values("TARGETA").append(project->first("DESTDIR") + project->first("QMAKE_PREFIX_STATICLIB")
                + project->first("TARGET") + "." + project->first("QMAKE_EXTENSION_STATICLIB"));

        ProStringList &ar_cmd = project->values("QMAKE_AR_CMD");
        if (!ar_cmd.isEmpty())
            ar_cmd[0] = ar_cmd.at(0).toQString().replace(QLatin1String("(TARGET)"), QLatin1String("(TARGETA)"));
        else
            ar_cmd.append("$(AR) $(TARGETA) $(OBJECTS)");
        if (!project->isEmpty("QMAKE_BUNDLE")) {
            project->values("PRL_TARGET").prepend(project->first("QMAKE_BUNDLE") +
                "/Versions/" + project->first("QMAKE_FRAMEWORK_VERSION") +
                "/Resources/" + project->first("TARGET"));
            ProString bundle_loc = project->first("QMAKE_BUNDLE_LOCATION");
            if(!bundle_loc.isEmpty() && !bundle_loc.startsWith("/"))
                bundle_loc.prepend("/");
            if(!bundle_loc.endsWith("/"))
                bundle_loc += "/";
            const QString target = project->first("QMAKE_BUNDLE") +
                                        bundle_loc + project->first("TARGET");
            project->values("TARGET_").append(target);
            if (!project->isActiveConfig("shallow_bundle")) {
                project->values("TARGET_x.y").append(project->first("QMAKE_BUNDLE") +
                                                          "/Versions/" +
                                                          project->first("QMAKE_FRAMEWORK_VERSION") +
                                                          bundle_loc + project->first("TARGET"));
            } else {
                project->values("TARGET_x.y").append(target);
            }
        } else if(project->isActiveConfig("plugin")) {
            QString prefix;
            if(!project->isActiveConfig("no_plugin_name_prefix"))
                prefix = "lib";
            project->values("PRL_TARGET").prepend(prefix + project->first("TARGET"));
            project->values("TARGET_x.y.z").append(prefix +
                                                        project->first("TARGET") + "." +
                                                        project->first("QMAKE_EXTENSION_PLUGIN"));
            if(project->isActiveConfig("lib_version_first"))
                project->values("TARGET_x").append(prefix + project->first("TARGET") + "." +
                                                        project->first("VER_MAJ") + "." +
                                                        project->first("QMAKE_EXTENSION_PLUGIN"));
            else
                project->values("TARGET_x").append(prefix + project->first("TARGET") + "." +
                                                        project->first("QMAKE_EXTENSION_PLUGIN") +
                                                        "." + project->first("VER_MAJ"));
            project->values("TARGET") = project->values("TARGET_x.y.z");
        } else if (!project->isEmpty("QMAKE_HPUX_SHLIB")) {
            project->values("PRL_TARGET").prepend("lib" + project->first("TARGET"));
            project->values("TARGET_").append("lib" + project->first("TARGET") + ".sl");
            if(project->isActiveConfig("lib_version_first"))
                project->values("TARGET_x").append("lib" + project->first("VER_MAJ") + "." +
                                                        project->first("TARGET"));
            else
                project->values("TARGET_x").append("lib" + project->first("TARGET") + "." +
                                                        project->first("VER_MAJ"));
            project->values("TARGET") = project->values("TARGET_x");
        } else if (!project->isEmpty("QMAKE_AIX_SHLIB")) {
            project->values("PRL_TARGET").prepend("lib" + project->first("TARGET"));
            project->values("TARGET_").append(project->first("QMAKE_PREFIX_STATICLIB") + project->first("TARGET")
                    + "." + project->first("QMAKE_EXTENSION_STATICLIB"));
            if(project->isActiveConfig("lib_version_first")) {
                project->values("TARGET_x").append("lib" + project->first("TARGET") + "." +
                                                        project->first("VER_MAJ") + "." +
                                                        project->first("QMAKE_EXTENSION_SHLIB"));
                project->values("TARGET_x.y").append("lib" + project->first("TARGET") + "." +
                                                          project->first("VER_MAJ") +
                                                          "." + project->first("VER_MIN") + "." +
                                                          project->first("QMAKE_EXTENSION_SHLIB"));
                project->values("TARGET_x.y.z").append("lib" + project->first("TARGET") + "." +
                                                            project->first("VER_MAJ") + "." +
                                                            project->first("VER_MIN") + "." +
                                                            project->first("VER_PAT") + "." +
                                                            project->first("QMAKE_EXTENSION_SHLIB"));
            } else {
                project->values("TARGET_x").append("lib" + project->first("TARGET") + "." +
                                                        project->first("QMAKE_EXTENSION_SHLIB") +
                                                        "." + project->first("VER_MAJ"));
                project->values("TARGET_x.y").append("lib" + project->first("TARGET") + "." +
                                                          project->first("QMAKE_EXTENSION_SHLIB") +
                                                          "." + project->first("VER_MAJ") +
                                                          "." + project->first("VER_MIN"));
                project->values("TARGET_x.y.z").append("lib" + project->first("TARGET") + "." +
                                                            project->first("QMAKE_EXTENSION_SHLIB") + "." +
                                                            project->first("VER_MAJ") + "." +
                                                            project->first("VER_MIN") + "." +
                                                            project->first("VER_PAT"));
            }
            project->values("TARGET") = project->values("TARGET_x.y.z");
        } else {
            project->values("PRL_TARGET").prepend("lib" + project->first("TARGET"));
            project->values("TARGET_").append("lib" + project->first("TARGET") + "." +
                                                   project->first("QMAKE_EXTENSION_SHLIB"));
            if(project->isActiveConfig("lib_version_first")) {
                project->values("TARGET_x").append("lib" + project->first("TARGET") + "." +
                                                        project->first("VER_MAJ") + "." +
                                                        project->first("QMAKE_EXTENSION_SHLIB"));
                project->values("TARGET_x.y").append("lib" + project->first("TARGET") + "." +
                                                          project->first("VER_MAJ") +
                                                          "." + project->first("VER_MIN") + "." +
                                                          project->first("QMAKE_EXTENSION_SHLIB"));
                project->values("TARGET_x.y.z").append("lib" + project->first("TARGET") + "." +
                                                            project->first("VER_MAJ") + "." +
                                                            project->first("VER_MIN") +  "." +
                                                            project->first("VER_PAT") + "." +
                                                            project->first("QMAKE_EXTENSION_SHLIB"));
            } else {
                project->values("TARGET_x").append("lib" + project->first("TARGET") + "." +
                                                        project->first("QMAKE_EXTENSION_SHLIB") +
                                                        "." + project->first("VER_MAJ"));
                project->values("TARGET_x.y").append("lib" + project->first("TARGET") + "." +
                                                      project->first("QMAKE_EXTENSION_SHLIB")
                                                      + "." + project->first("VER_MAJ") +
                                                      "." + project->first("VER_MIN"));
                project->values("TARGET_x.y.z").append("lib" + project->first("TARGET") +
                                                            "." +
                                                            project->first(
                                                                "QMAKE_EXTENSION_SHLIB") + "." +
                                                            project->first("VER_MAJ") + "." +
                                                            project->first("VER_MIN") +  "." +
                                                            project->first("VER_PAT"));
            }
            if (project->isActiveConfig("unversioned_libname"))
                project->values("TARGET") = project->values("TARGET_");
            else
                project->values("TARGET") = project->values("TARGET_x.y.z");
        }
        if (!project->values("QMAKE_LFLAGS_SONAME").isEmpty()) {
            ProString soname;
            if(project->isActiveConfig("plugin")) {
                if(!project->values("TARGET").isEmpty())
                    soname += project->first("TARGET");
            } else if(!project->isEmpty("QMAKE_BUNDLE")) {
                soname += project->first("TARGET_x.y");
            } else if(project->isActiveConfig("unversioned_soname")) {
                soname = "lib" + project->first("QMAKE_ORIG_TARGET")
                    + "." + project->first("QMAKE_EXTENSION_SHLIB");
            } else if(!project->values("TARGET_x").isEmpty()) {
                soname += project->first("TARGET_x");
            }
            if(!soname.isEmpty()) {
                if(project->isActiveConfig("absolute_library_soname") &&
                   project->values("INSTALLS").indexOf("target") != -1 &&
                   !project->isEmpty("target.path")) {
                    QString instpath = Option::fixPathToTargetOS(project->first("target.path").toQString());
                    if(!instpath.endsWith(Option::dir_sep))
                        instpath += Option::dir_sep;
                    soname.prepend(instpath);
                } else if (!project->isEmpty("QMAKE_SONAME_PREFIX")) {
                    QString sonameprefix = project->first("QMAKE_SONAME_PREFIX").toQString();
                    if (!sonameprefix.startsWith('@'))
                        sonameprefix = Option::fixPathToTargetOS(sonameprefix, false);
                    if (!sonameprefix.endsWith(Option::dir_sep))
                        sonameprefix += Option::dir_sep;
                    soname.prepend(sonameprefix);
                }
                project->values("QMAKE_LFLAGS_SONAME").first() += escapeFilePath(soname);
            }
        }
        if (project->values("QMAKE_LINK_SHLIB_CMD").isEmpty())
            project->values("QMAKE_LINK_SHLIB_CMD").append(
                "$(LINK) $(LFLAGS) " + project->first("QMAKE_LINK_O_FLAG") + "$(TARGET) $(OBJECTS) $(LIBS) $(OBJCOMP)");
    }
    if (!project->values("QMAKE_APP_FLAG").isEmpty() || project->first("TEMPLATE") == "aux") {
        project->values("QMAKE_CFLAGS") += project->values("QMAKE_CFLAGS_APP");
        project->values("QMAKE_CXXFLAGS") += project->values("QMAKE_CXXFLAGS_APP");
        project->values("QMAKE_LFLAGS") += project->values("QMAKE_LFLAGS_APP");
    } else if (project->isActiveConfig("dll")) {
        if(!project->isActiveConfig("plugin") || !project->isActiveConfig("plugin_no_share_shlib_cflags")) {
            project->values("QMAKE_CFLAGS") += project->values("QMAKE_CFLAGS_SHLIB");
            project->values("QMAKE_CXXFLAGS") += project->values("QMAKE_CXXFLAGS_SHLIB");
        }
        if (project->isActiveConfig("plugin")) {
            project->values("QMAKE_CFLAGS") += project->values("QMAKE_CFLAGS_PLUGIN");
            project->values("QMAKE_CXXFLAGS") += project->values("QMAKE_CXXFLAGS_PLUGIN");
            project->values("QMAKE_LFLAGS") += project->values("QMAKE_LFLAGS_PLUGIN");
            if (project->isActiveConfig("plugin_with_soname"))
                project->values("QMAKE_LFLAGS") += project->values("QMAKE_LFLAGS_SONAME");
        } else {
            project->values("QMAKE_LFLAGS") += project->values("QMAKE_LFLAGS_SHLIB");
            if(!project->isEmpty("QMAKE_LFLAGS_COMPAT_VERSION")) {
                if(project->isEmpty("COMPAT_VERSION"))
                    project->values("QMAKE_LFLAGS") += QString(project->first("QMAKE_LFLAGS_COMPAT_VERSION") +
                                                                    project->first("VER_MAJ") + "." +
                                                                    project->first("VER_MIN"));
                else
                    project->values("QMAKE_LFLAGS") += QString(project->first("QMAKE_LFLAGS_COMPAT_VERSION") +
                                                                    project->first("COMPATIBILITY_VERSION"));
            }
            if(!project->isEmpty("QMAKE_LFLAGS_VERSION")) {
                project->values("QMAKE_LFLAGS") += QString(project->first("QMAKE_LFLAGS_VERSION") +
                                                                project->first("VER_MAJ") + "." +
                                                                project->first("VER_MIN") + "." +
                                                                project->first("VER_PAT"));
            }
            project->values("QMAKE_LFLAGS") += project->values("QMAKE_LFLAGS_SONAME");
        }
    }

    if (include_deps && project->isActiveConfig("gcc_MD_depends")) {
        ProString MD_flag("-MD");
        project->values("QMAKE_CFLAGS") += MD_flag;
        project->values("QMAKE_CXXFLAGS") += MD_flag;
    }
}